

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::compSyncResidualFine
          (MLNodeLaplacian *this,MultiFab *sync_resid,MultiFab *phi,MultiFab *vold,MultiFab *rhcc)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Real RVar12;
  pointer paVar13;
  EBCellFlagFab *this_00;
  pointer paVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  bool bVar28;
  int i_1;
  FabType FVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  int *piVar34;
  long lVar35;
  DataAllocator DVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  bool bVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  bool bVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  double *pdVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  double *pdVar70;
  long lVar71;
  uint uVar72;
  long lVar73;
  double *pdVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  double *pdVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  Real RVar99;
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  ulong uVar109;
  double dVar110;
  double dVar111;
  int iVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  Box bx_3;
  Box lhs;
  Box bx_2;
  Box bx;
  Box result;
  Real facz;
  Real facy;
  Real facx;
  Box bx_5;
  Box bx_4;
  MFIter mfi;
  Box bx_1;
  FArrayBox cn;
  FArrayBox sten;
  FArrayBox u;
  IArrayBox tmpmask;
  FArrayBox rhs;
  Real facy_2;
  Real fm2xm2y4z;
  Real f2x2ymz;
  Real f2xmy2z;
  Real fmx2y2z;
  Real fxyz;
  Real fm2x4ym2z;
  Real f4xm2ym2z;
  Real facx_2;
  Real facz_2;
  Elixir steneli;
  Elixir rhseli;
  Elixir tmeli;
  Elixir ueli;
  Elixir cneli;
  MFItInfo mfi_info;
  long local_c88;
  long local_c80;
  long local_c78;
  long local_c70;
  double *local_c68;
  double *local_c60;
  double *local_c58;
  double *local_c50;
  double *local_c48;
  long local_c40;
  long local_c38;
  long local_c30;
  long local_c28;
  double *local_c20;
  double *local_c18;
  long local_c10;
  double *local_c08;
  double *local_c00;
  long local_bf8;
  double *local_bf0;
  int *local_be0;
  ulong local_bd8;
  long local_bd0;
  double *local_bc8;
  long local_bc0;
  double *local_bb8;
  long local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  double *local_b80;
  long local_b78;
  double *local_b68;
  long local_b60;
  long local_b48;
  double *local_b40;
  long local_b30;
  long local_b28;
  long local_b20;
  long local_b10;
  long local_b00;
  long local_af8;
  long local_af0;
  long local_ae8;
  long local_ae0;
  long local_ad8;
  long local_ad0;
  long local_ac8;
  long local_ac0;
  long local_ab8;
  Box local_aa8;
  long local_a88;
  ulong local_a80;
  ulong local_a78;
  long local_a70;
  long local_a68;
  FabType local_a5c;
  long local_a58;
  long local_a50;
  long local_a48;
  double *local_a40;
  ulong local_a38;
  long local_a30;
  ulong local_a28;
  int *local_a20;
  long local_a18;
  double *local_a10;
  ulong local_a08;
  double *local_a00;
  double *local_9f8;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  long local_9d8;
  long local_9d0;
  Box local_9c8;
  double *local_9a0;
  ulong local_998;
  long local_990;
  long local_988;
  double *local_980;
  long local_978;
  long local_970;
  long local_968;
  LinOpBCType local_960;
  LinOpBCType local_95c;
  LinOpBCType local_958;
  LinOpBCType local_954;
  long local_950;
  long local_948;
  long local_940;
  long local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  double *local_908;
  long local_900;
  long local_8f8;
  long local_8f0;
  long local_8e8;
  long local_8e0;
  long local_8d8;
  long local_8d0;
  long local_8c8;
  long local_8c0;
  long local_8b8;
  long local_8b0;
  ulong local_8a8;
  long local_8a0;
  long local_898;
  long local_890;
  long local_888;
  long local_880;
  double *local_878;
  LinOpBCType local_870;
  LinOpBCType local_86c;
  undefined8 local_868;
  int iStack_860;
  int aiStack_85c [5];
  undefined8 local_848;
  int local_840;
  int local_83c [2];
  undefined8 uStack_834;
  MLNodeLaplacian *local_820;
  FabArray<amrex::FArrayBox> *local_818;
  long local_810;
  long local_808;
  long local_800;
  ulong local_7f8;
  long local_7f0;
  undefined8 local_7e8;
  int iStack_7e0;
  int aiStack_7dc [2];
  undefined8 uStack_7d4;
  Box local_7c8;
  undefined8 local_7a8;
  FabType FStack_7a0;
  int iStack_79c;
  uint local_798;
  FabType local_794;
  long local_788;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_780;
  long local_778;
  FabArray<amrex::EBCellFlagFab> *local_770;
  int local_764;
  Array4<const_double> local_760;
  Box local_71c;
  Array4<const_double> local_700;
  Array4<const_double> local_6c0;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  double *local_660;
  long *local_658;
  FabArray<amrex::FArrayBox> *local_650;
  FabArray<amrex::FArrayBox> *local_648;
  long local_640;
  long local_638;
  double local_630;
  double local_628;
  double local_620;
  int local_618;
  int local_614;
  int local_60c [5];
  Array4<const_double> local_5f8;
  Array4<const_double> local_5b8;
  Array4<const_amrex::EBCellFlag> local_578;
  long local_530;
  long local_528;
  FabArray<amrex::FArrayBox> *local_520;
  FabArray<amrex::IArrayBox> *local_518;
  FabArray<amrex::FArrayBox> *local_510;
  long local_508;
  ulong local_500;
  long local_4f8;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  long local_4d0;
  long local_4c8;
  long local_4c0;
  long local_4b8;
  ulong local_4b0;
  MFIter local_4a8;
  Array4<const_double> local_448;
  BaseFab<double> local_400;
  BaseFab<double> local_3b8;
  BaseFab<double> local_370;
  BaseFab<int> local_328;
  BaseFab<double> local_2e0;
  double local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  double local_278;
  undefined8 uStack_270;
  double local_268;
  undefined8 uStack_260;
  double local_258;
  undefined8 uStack_250;
  double local_248;
  undefined8 uStack_240;
  double local_238;
  undefined8 uStack_230;
  double local_228;
  undefined8 uStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  Elixir local_138;
  Elixir local_120;
  Elixir local_108;
  Elixir local_f0;
  Array4<const_int> local_d8;
  Box local_98;
  Box local_7c;
  Elixir local_60;
  MFItInfo local_44;
  
  local_658 = *(long **)&(((this->m_sigma).
                           super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                         ).
                         super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  local_518 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  paVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_86c = paVar13->_M_elems[0];
  local_954 = paVar13->_M_elems[1];
  local_95c = paVar13->_M_elems[2];
  paVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_870 = paVar13->_M_elems[0];
  local_958 = paVar13->_M_elems[1];
  local_960 = paVar13->_M_elems[2];
  lVar33 = **(long **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       ).
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  local_820 = this;
  local_650 = &sync_resid->super_FabArray<amrex::FArrayBox>;
  local_648 = &rhcc->super_FabArray<amrex::FArrayBox>;
  local_520 = &phi->super_FabArray<amrex::FArrayBox>;
  local_510 = &vold->super_FabArray<amrex::FArrayBox>;
  if (lVar33 == 0) {
    lVar33 = 0;
  }
  else {
    lVar33 = __dynamic_cast(lVar33,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo);
  }
  if (lVar33 == 0) {
    local_770 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_770 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar33 + 0xd8));
  }
  local_780._M_head_impl =
       *(MultiFab **)
        &(((local_820->m_integral).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if (lVar33 == 0) {
    local_818 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_818 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar33 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
  }
  lVar35 = *(long *)&(((local_820->super_MLNodeLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar37 = lVar35 + 0xac;
  local_7e8 = *(undefined8 *)(lVar35 + 0xac);
  aiStack_7dc[1] = (int)((ulong)*(undefined8 *)(lVar35 + 0xb8) >> 0x20);
  uStack_7d4 = *(undefined8 *)(lVar35 + 0xc0);
  iStack_7e0 = (int)*(undefined8 *)(lVar35 + 0xb4);
  aiStack_7dc[0] = (int)((ulong)*(undefined8 *)(lVar35 + 0xb4) >> 0x20);
  lVar44 = 0;
  do {
    if ((uStack_7d4._4_4_ >> ((uint)lVar44 & 0x1f) & 1) == 0) {
      aiStack_7dc[lVar44] = aiStack_7dc[lVar44] + 1;
    }
    lVar44 = lVar44 + 1;
  } while (lVar44 != 3);
  uStack_7d4 = CONCAT44(7,(int)uStack_7d4);
  dVar91 = *(double *)(lVar35 + 0x38);
  dVar114 = *(double *)(lVar35 + 0x40);
  dVar107 = *(double *)(lVar35 + 0x48);
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_0083cec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  FArrayBox::FArrayBox((FArrayBox *)&local_2e0);
  FArrayBox::FArrayBox((FArrayBox *)&local_370);
  IArrayBox::IArrayBox((IArrayBox *)&local_328);
  FArrayBox::FArrayBox((FArrayBox *)&local_3b8);
  FArrayBox::FArrayBox((FArrayBox *)&local_400);
  MFIter::MFIter(&local_4a8,&local_650->super_FabArrayBase,&local_44);
  if (local_4a8.currentIndex < local_4a8.endIndex) {
    local_620 = dVar91 * 0.25;
    local_628 = dVar114 * 0.25;
    local_630 = dVar107 * 0.25;
    local_158 = dVar91 * 0.027777777777777776 * dVar91;
    local_1f8._0_8_ = dVar114 * 0.027777777777777776 * dVar114;
    local_1f8._8_8_ = 0;
    local_148 = dVar107 * 0.027777777777777776 * dVar107;
    local_208 = (double)local_1f8._0_8_ + (double)local_1f8._0_8_;
    local_218 = local_158 * 4.0;
    uStack_210 = 0;
    local_188 = (local_218 - local_208) + local_148 * -2.0;
    uStack_180 = 0;
    local_228 = (double)local_1f8._0_8_ * 4.0;
    local_238 = local_158 * -2.0;
    uStack_220 = 0;
    local_198 = local_238 + local_228 + local_148 * -2.0;
    uStack_190 = 0;
    local_1a8 = local_158 + (double)local_1f8._0_8_ + local_148;
    uStack_1a0 = 0;
    local_248 = -local_158;
    uStack_240 = 0x8000000000000000;
    local_168 = local_148 + local_148;
    local_1b8 = (local_208 - local_158) + local_168;
    uStack_1b0 = 0;
    local_178 = -(double)local_1f8._0_8_;
    uStack_170 = 0x8000000000000000;
    uStack_150 = 0;
    local_258 = local_158 + local_158;
    local_1c8._0_8_ = (local_258 - (double)local_1f8._0_8_) + local_168;
    local_1c8._8_8_ = 0;
    uStack_250 = 0;
    local_1d8 = (local_258 + local_208) - local_148;
    uStack_1d0 = 0;
    local_268 = -local_208;
    uStack_260 = 0x8000000000000000;
    uStack_230 = 0;
    uStack_200 = 0;
    local_278 = local_148 * 4.0;
    uStack_270 = 0;
    local_1e8 = (local_238 - local_208) + local_278;
    uStack_1e0 = 0;
    uStack_160 = 0;
    local_288 = -local_168;
    uStack_280 = 0x8000000000000000;
    uStack_140 = 0;
    local_298 = -local_148;
    uStack_290 = 0x8000000000000000;
    local_530 = lVar37;
    local_528 = lVar33;
    do {
      MFIter::tilebox(&local_aa8,&local_4a8);
      FVar29 = regular;
      if (lVar33 != 0) {
        piVar34 = &local_4a8.currentIndex;
        if (local_4a8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar34 = ((local_4a8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_4a8.currentIndex;
        }
        this_00 = (local_770->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar34];
        local_448.kstride._0_4_ = local_aa8.bigend.vect[1];
        local_448.kstride._4_4_ = local_aa8.bigend.vect[2];
        local_448.p = (double *)CONCAT44(local_aa8.smallend.vect[1],local_aa8.smallend.vect[0]);
        local_448.jstride._0_4_ = local_aa8.smallend.vect[2];
        local_448.jstride._4_4_ = local_aa8.bigend.vect[0];
        lVar35 = 0;
        do {
          if ((local_aa8.btype.itype >> ((uint)lVar35 & 0x1f) & 1) != 0) {
            piVar34 = (int *)((long)&local_448.jstride + lVar35 * 4 + 4);
            *piVar34 = *piVar34 + -1;
          }
          lVar35 = lVar35 + 1;
        } while (lVar35 != 3);
        local_448.nstride._0_4_ = 0;
        FVar29 = EBCellFlagFab::getType(this_00,(Box *)&local_448);
      }
      if (FVar29 != covered) {
        local_a5c = FVar29;
        MFIter::growntilebox(&local_71c,&local_4a8,-1000000);
        BATransformer::operator()
                  (&local_7c,&((local_4a8.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_4a8.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_4a8.currentIndex] * 0x1c +
                          *(long *)&((((local_4a8.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        local_83c[1] = local_7c.bigend.vect[1];
        uStack_834._0_4_ = local_7c.bigend.vect[2];
        uStack_834._4_4_ = local_7c.btype.itype;
        local_848._0_4_ = local_7c.smallend.vect[0];
        local_848._4_4_ = local_7c.smallend.vect[1];
        local_840 = local_7c.smallend.vect[2];
        local_83c[0] = local_7c.bigend.vect[0];
        lVar33 = 0;
        do {
          if ((uStack_834._4_4_ >> ((uint)lVar33 & 0x1f) & 1) != 0) {
            local_83c[lVar33] = local_83c[lVar33] + -1;
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        uStack_834 = uStack_834 & 0xffffffff;
        local_9c8.smallend.vect[0] = local_aa8.smallend.vect[0] + -1;
        local_9c8.smallend.vect[1] = local_aa8.smallend.vect[1] + -1;
        local_9c8.smallend.vect[2] = local_aa8.smallend.vect[2] + covered;
        local_9c8.bigend.vect[0] = local_aa8.bigend.vect[0] + 1;
        local_9c8.bigend.vect[1] = local_aa8.bigend.vect[1] + 1;
        local_9c8.bigend.vect[2] = local_aa8.bigend.vect[2] + singlevalued;
        lVar33 = 0;
        do {
          if ((local_aa8.btype.itype >> ((uint)lVar33 & 0x1f) & 1) != 0) {
            piVar34 = local_9c8.bigend.vect + lVar33;
            *piVar34 = *piVar34 + -1;
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != 3);
        local_9c8.btype.itype = 0;
        FArrayBox::resize((FArrayBox *)&local_370,&local_9c8,3,(Arena *)0x0);
        DVar36.m_arena = local_370.super_DataAllocator.m_arena;
        if (local_370.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar36.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_f0,(void *)0x0,DVar36.m_arena);
        iVar2 = local_370.domain.smallend.vect[2];
        iVar15 = local_370.domain.smallend.vect[1];
        pdVar74 = local_370.dptr;
        local_a58 = (long)local_370.domain.smallend.vect[0];
        lVar44 = (long)local_370.domain.smallend.vect[1];
        lVar65 = (long)local_370.domain.smallend.vect[2];
        lVar33 = (long)((local_370.domain.bigend.vect[1] - local_370.domain.smallend.vect[1]) + 1);
        lVar35 = (long)((local_370.domain.bigend.vect[2] - local_370.domain.smallend.vect[2]) + 1);
        uVar104 = CONCAT44(-(uint)(local_9c8.smallend.vect[1] < (int)(local_848 >> 0x20)),
                           -(uint)(local_9c8.smallend.vect[0] < (int)local_848));
        local_868 = ~uVar104 & CONCAT44(local_9c8.smallend.vect[1],local_9c8.smallend.vect[0]) |
                    local_848 & uVar104;
        iStack_860 = local_9c8.smallend.vect[2];
        if (local_9c8.smallend.vect[2] < local_840) {
          iStack_860 = local_840;
        }
        uVar104 = CONCAT44(-(uint)(local_83c[1] < local_9c8.bigend.vect[1]),
                           -(uint)(local_83c[0] < local_9c8.bigend.vect[0]));
        uVar104 = ~uVar104 & CONCAT44(local_9c8.bigend.vect[1],local_9c8.bigend.vect[0]) |
                  CONCAT44(local_83c[1],local_83c[0]) & uVar104;
        aiStack_85c[0] = (int)uVar104;
        aiStack_85c[1] = (int)(uVar104 >> 0x20);
        aiStack_85c[2] = (int)uStack_834;
        iVar32 = local_9c8.bigend.vect[2];
        if (aiStack_85c[2] < local_9c8.bigend.vect[2]) {
          iVar32 = aiStack_85c[2];
        }
        aiStack_85c[3] = (int)(uStack_834 >> 0x20);
        aiStack_85c[2] = iVar32;
        paVar13 = (local_820->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar14 = (local_820->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar55 = 0;
        do {
          if ((*(int *)((long)paVar13->_M_elems + lVar55) == 0x6a) &&
             (*(int *)((long)&local_868 + lVar55) == *(int *)(lVar37 + lVar55))) {
            *(int *)((long)&local_868 + lVar55) = *(int *)((long)&local_868 + lVar55) + -1;
          }
          if ((*(int *)((long)paVar14->_M_elems + lVar55) == 0x6a) &&
             (*(int *)((long)aiStack_85c + lVar55) == *(int *)(lVar37 + 0xc + lVar55))) {
            *(int *)((long)aiStack_85c + lVar55) = *(int *)((long)aiStack_85c + lVar55) + 1;
          }
          lVar55 = lVar55 + 4;
        } while (lVar55 != 0xc);
        lVar45 = (long)((local_370.domain.bigend.vect[0] - local_370.domain.smallend.vect[0]) + 1);
        lVar37 = lVar33 * lVar45;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_448,local_510,&local_4a8);
        lVar55 = (long)local_9c8.smallend.vect[2];
        if (local_9c8.smallend.vect[2] <= local_9c8.bigend.vect[2]) {
          lVar82 = (long)local_9c8.smallend.vect[1];
          lVar63 = (long)local_9c8.smallend.vect[0];
          lVar73 = (lVar82 * 8 + (lVar55 - lVar65) * lVar33 * 8 + lVar44 * -8) * lVar45 + lVar63 * 8
                   + local_a58 * -8 + (long)pdVar74;
          lVar75 = ((lVar35 * 8 + lVar55 * 8 + lVar65 * -8) * lVar33 + lVar82 * 8 + lVar44 * -8) *
                   lVar45 + lVar63 * 8 + local_a58 * -8 + (long)pdVar74;
          lVar50 = ((lVar35 * 0x10 + lVar55 * 8 + lVar65 * -8) * lVar33 + lVar82 * 8 + lVar44 * -8)
                   * lVar45 + lVar63 * 8 + local_a58 * -8 + (long)pdVar74;
          lVar60 = lVar37 * 8;
          lVar68 = lVar45 * 8;
          do {
            lVar48 = lVar82;
            lVar56 = lVar50;
            lVar59 = lVar73;
            lVar76 = lVar75;
            if (local_9c8.smallend.vect[1] <= local_9c8.bigend.vect[1]) {
              do {
                if (local_9c8.smallend.vect[0] <= local_9c8.bigend.vect[0]) {
                  lVar77 = (long)local_448.begin.x;
                  lVar52 = (lVar55 - local_448.begin.z) *
                           CONCAT44(local_448.kstride._4_4_,(uint)local_448.kstride);
                  lVar83 = (lVar48 - local_448.begin.y) *
                           CONCAT44(local_448.jstride._4_4_,(FabType)local_448.jstride);
                  lVar78 = 0;
                  do {
                    if ((((lVar63 + lVar78 < (long)(int)local_868) || (lVar48 < local_868._4_4_)) ||
                        (lVar55 < iStack_860)) ||
                       ((((long)aiStack_85c[0] < lVar63 + lVar78 || (aiStack_85c[1] < lVar48)) ||
                        (aiStack_85c[2] < lVar55)))) {
                      *(undefined8 *)(lVar59 + lVar78 * 8) = 0;
                      *(undefined8 *)(lVar76 + lVar78 * 8) = 0;
                      *(undefined8 *)(lVar56 + lVar78 * 8) = 0;
                    }
                    else {
                      *(double *)(lVar59 + lVar78 * 8) =
                           local_448.p[lVar63 + ((lVar52 + lVar83 + lVar78) - lVar77)];
                      *(double *)(lVar76 + lVar78 * 8) =
                           local_448.p
                           [lVar63 + ((lVar52 + lVar83 + CONCAT44(local_448.nstride._4_4_,
                                                                  (undefined4)local_448.nstride) +
                                                         lVar78) - lVar77)];
                      *(double *)(lVar56 + lVar78 * 8) =
                           local_448.p
                           [lVar63 + ((lVar52 + lVar83 + CONCAT44(local_448.nstride._4_4_,
                                                                  (undefined4)local_448.nstride) * 2
                                                         + lVar78) - lVar77)];
                    }
                    lVar78 = lVar78 + 1;
                  } while ((local_9c8.bigend.vect[0] - local_9c8.smallend.vect[0]) + 1 !=
                           (int)lVar78);
                }
                lVar48 = lVar48 + 1;
                lVar59 = lVar59 + lVar68;
                lVar76 = lVar76 + lVar68;
                lVar56 = lVar56 + lVar68;
              } while (local_9c8.bigend.vect[1] + 1 != (int)lVar48);
            }
            lVar55 = lVar55 + 1;
            lVar73 = lVar73 + lVar60;
            lVar75 = lVar75 + lVar60;
            lVar50 = lVar50 + lVar60;
          } while (local_9c8.bigend.vect[2] + 1 != (int)lVar55);
        }
        IArrayBox::resize((IArrayBox *)&local_328,&local_aa8,1,(Arena *)0x0);
        DVar36.m_arena = local_328.super_DataAllocator.m_arena;
        if (local_328.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar36.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_108,(void *)0x0,DVar36.m_arena);
        local_a20 = local_328.dptr;
        local_920 = (long)local_328.domain.smallend.vect[0];
        local_928 = (long)local_328.domain.smallend.vect[1];
        local_930 = (long)local_328.domain.smallend.vect[2];
        local_a50 = (long)((local_328.domain.bigend.vect[0] - local_328.domain.smallend.vect[0]) + 1
                          );
        local_a88 = (long)((local_328.domain.bigend.vect[1] - local_328.domain.smallend.vect[1]) + 1
                          );
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d8,local_518,&local_4a8)
        ;
        lVar55 = (long)local_aa8.smallend.vect[2];
        if (local_aa8.smallend.vect[2] <= local_aa8.bigend.vect[2]) {
          local_c80 = ((long)local_aa8.smallend.vect[1] * 4 + (lVar55 - local_930) * local_a88 * 4 +
                      local_928 * -4) * local_a50 + (long)local_aa8.smallend.vect[0] * 4 +
                      local_920 * -4 + (long)local_a20;
          do {
            if (local_aa8.smallend.vect[1] <= local_aa8.bigend.vect[1]) {
              lVar60 = (long)local_aa8.smallend.vect[1];
              lVar68 = local_c80;
              do {
                if (local_aa8.smallend.vect[0] <= local_aa8.bigend.vect[0]) {
                  lVar50 = 0;
                  do {
                    *(int *)(lVar68 + lVar50 * 4) =
                         1 - *(int *)((long)local_d8.p +
                                     lVar50 * 4 +
                                     (lVar60 - local_d8.begin.y) * local_d8.jstride * 4 +
                                     (lVar55 - local_d8.begin.z) * local_d8.kstride * 4 +
                                     (long)local_d8.begin.x * -4 +
                                     (long)local_aa8.smallend.vect[0] * 4);
                    lVar50 = lVar50 + 1;
                  } while ((local_aa8.bigend.vect[0] - local_aa8.smallend.vect[0]) + 1 !=
                           (int)lVar50);
                }
                lVar60 = lVar60 + 1;
                lVar68 = lVar68 + local_a50 * 4;
              } while (local_aa8.bigend.vect[1] + 1U != (int)lVar60);
            }
            lVar55 = lVar55 + 1;
            local_c80 = local_c80 + local_a88 * local_a50 * 4;
          } while (local_aa8.bigend.vect[2] + singlevalued != (int)lVar55);
        }
        FArrayBox::resize((FArrayBox *)&local_2e0,&local_aa8,1,(Arena *)0x0);
        DVar36.m_arena = local_2e0.super_DataAllocator.m_arena;
        if (local_2e0.super_DataAllocator.m_arena == (Arena *)0x0) {
          DVar36.m_arena = The_Arena();
        }
        Gpu::Elixir::Elixir(&local_120,(void *)0x0,DVar36.m_arena);
        local_9f8 = local_2e0.dptr;
        local_8f8 = (long)local_2e0.domain.smallend.vect[0];
        local_940 = (long)local_2e0.domain.smallend.vect[1];
        local_8e8 = (long)local_2e0.domain.smallend.vect[2];
        local_a18 = (long)((local_2e0.domain.bigend.vect[0] - local_2e0.domain.smallend.vect[0]) + 1
                          );
        local_810 = (long)((local_2e0.domain.bigend.vect[1] - local_2e0.domain.smallend.vect[1]) + 1
                          );
        local_948 = local_810 * local_a18;
        if (local_a5c == singlevalued) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_6c0,local_818,&local_4a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_700,&(local_780._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                     &local_4a8);
          local_c30 = (long)local_aa8.smallend.vect[2];
          local_8a0 = CONCAT44(local_8a0._4_4_,local_aa8.bigend.vect[2]);
          if (local_aa8.smallend.vect[2] <= local_aa8.bigend.vect[2]) {
            local_a00 = (double *)(long)local_aa8.smallend.vect[1];
            local_9a0 = (double *)(long)local_aa8.smallend.vect[0];
            local_900 = (long)local_9a0 * 8;
            local_998 = local_c30 - 1;
            lVar68 = lVar35 * 0x10 + local_c30 * 8 + lVar65 * -8;
            lVar63 = (lVar68 + -8) * lVar33 + (long)local_a00 * 8 + lVar44 * -8;
            lVar60 = ((local_c30 + lVar35) * 8 + lVar65 * -8 + -8) * lVar33 + (long)local_a00 * 8 +
                     lVar44 * -8;
            lVar55 = (long)local_a00 * 8 + (local_998 - lVar65) * lVar33 * 8 + lVar44 * -8;
            lVar50 = lVar68 * lVar33 + (long)local_a00 * 8 + lVar44 * -8;
            lVar35 = (lVar35 * 8 + local_c30 * 8 + lVar65 * -8) * lVar33 + (long)local_a00 * 8 +
                     lVar44 * -8;
            lVar68 = (long)local_a00 * 8 + (local_c30 - lVar65) * lVar33 * 8 + lVar44 * -8;
            local_8a0 = CONCAT44(local_8a0._4_4_,local_aa8.bigend.vect[2] + singlevalued);
            local_9d8 = (long)aiStack_7dc[0] - (long)local_9a0;
            local_9d0 = (long)(int)local_7e8 - (long)local_9a0;
            local_910 = (lVar63 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_918 = (lVar60 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_8b0 = (lVar55 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_8b8 = (lVar50 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_8c0 = (lVar35 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_8c8 = (lVar68 + -8) * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_8d0 = lVar63 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_8d8 = lVar60 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_8e0 = lVar55 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_950 = lVar50 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_888 = lVar35 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_890 = lVar68 * lVar45 + (long)local_9a0 * 8 + local_a58 * -8 + (long)pdVar74;
            local_898 = ((long)local_a00 * 4 + (local_c30 - local_930) * local_a88 * 4 +
                        local_928 * -4) * local_a50 + (long)local_9a0 * 4 + local_920 * -4 +
                        (long)local_a20;
            local_7f0 = local_a88 * local_a50 * 4;
            local_878 = (double *)CONCAT44(local_878._4_4_,local_aa8.bigend.vect[0]);
            local_7f8 = (ulong)(uint)local_aa8.bigend.vect[1];
            local_a40 = (double *)(long)local_7e8._4_4_;
            local_988 = (long)iStack_7e0;
            local_980 = (double *)(long)aiStack_7dc[1];
            local_990 = (long)(int)uStack_7d4;
            local_880 = CONCAT44(local_880._4_4_,local_aa8.bigend.vect[1] + 1U);
            local_8f0 = (long)local_a00 + -1;
            local_800 = lVar37 * 8;
            local_8a8 = lVar45 * 8;
            local_9f0 = local_a50 * 4;
            do {
              if (local_aa8.smallend.vect[1] <= local_aa8.bigend.vect[1]) {
                local_908 = local_9f8 + (local_c30 - local_8e8) * local_948;
                bVar46 = local_c30 == local_988 && local_95c == inflow;
                local_9e0 = CONCAT71(local_9e0._1_7_,bVar46);
                bVar40 = local_c30 == local_990 && local_960 == inflow;
                local_9e8 = CONCAT71(local_9e8._1_7_,bVar40);
                local_c88 = local_898;
                local_b40 = (double *)local_890;
                local_b98 = local_888;
                local_ac8 = local_950;
                local_ad0 = local_8e0;
                local_b20 = local_8d8;
                local_ad8 = local_8d0;
                local_ae0 = local_8c8;
                local_ae8 = local_8c0;
                local_b48 = local_8b8;
                local_b28 = local_8b0;
                local_b30 = local_918;
                local_a68 = local_910;
                local_c00 = local_a00;
                local_a48 = local_8f0;
                do {
                  if (local_aa8.smallend.vect[0] <= local_aa8.bigend.vect[0]) {
                    bVar41 = local_c00 == local_a40 && local_954 == inflow;
                    local_938 = CONCAT71(local_938._1_7_,bVar41);
                    lVar78 = (long)local_700.begin.x;
                    lVar76 = (local_998 - (long)local_700.begin.z) * local_700.kstride * 8;
                    lVar48 = (local_a48 - local_700.begin.y) * local_700.jstride * 8;
                    lVar35 = lVar76 + lVar48;
                    lVar83 = local_700.nstride * 0x38;
                    lVar55 = (local_c30 - local_700.begin.z) * local_700.kstride * 8;
                    lVar48 = lVar48 + lVar55;
                    lVar52 = ((long)local_c00 - (long)local_700.begin.y) * local_700.jstride * 8;
                    lVar76 = lVar76 + lVar52;
                    lVar52 = lVar52 + lVar55;
                    lVar77 = local_700.nstride * 0x10;
                    lVar55 = local_700.nstride * 0x30;
                    lVar79 = local_700.nstride * 0x40;
                    local_a78 = (long)local_700.p + lVar35 + lVar55 + lVar78 * -8 + local_900;
                    lVar60 = lVar35 + lVar83 + lVar78 * -8 + local_900;
                    lVar68 = lVar35 + lVar78 * -8 + local_900;
                    lVar50 = lVar35 + lVar79 + lVar78 * -8 + local_900;
                    lVar63 = lVar35 + lVar77 + lVar78 * -8 + local_900;
                    lVar35 = lVar35 + local_700.nstride * 8 + lVar78 * -8 + local_900;
                    lVar73 = lVar48 + lVar55 + lVar78 * -8 + local_900;
                    lVar75 = lVar48 + lVar83 + lVar78 * -8 + local_900;
                    local_a30 = (long)local_700.p + lVar48 + lVar78 * -8 + local_900;
                    local_a28 = (long)local_700.p + lVar48 + lVar79 + lVar78 * -8 + local_900;
                    lVar82 = lVar48 + lVar77 + lVar78 * -8 + local_900;
                    lVar48 = lVar48 + local_700.nstride * 8 + lVar78 * -8 + local_900;
                    local_968 = (long)local_700.p + lVar76 + lVar55 + lVar78 * -8 + local_900;
                    local_970 = (long)local_700.p + lVar76 + lVar83 + lVar78 * -8 + local_900;
                    lVar56 = lVar76 + lVar78 * -8 + local_900;
                    local_978 = (long)local_700.p + lVar76 + lVar79 + lVar78 * -8 + local_900;
                    lVar59 = lVar76 + lVar77 + lVar78 * -8 + local_900;
                    lVar76 = lVar76 + local_700.nstride * 8 + lVar78 * -8 + local_900;
                    local_a08 = (long)local_700.p + lVar55 + lVar52 + lVar78 * -8 + local_900;
                    local_a70 = (long)local_700.p + lVar83 + lVar52 + lVar78 * -8 + local_900;
                    lVar55 = lVar52 + lVar78 * -8 + local_900;
                    local_a38 = (long)local_700.p + lVar79 + lVar52 + lVar78 * -8 + local_900;
                    local_a80 = (long)local_700.p + lVar77 + lVar52 + lVar78 * -8 + local_900;
                    lVar52 = local_700.nstride * 8 + lVar52 + lVar78 * -8 + local_900;
                    lVar83 = (local_998 - (long)local_6c0.begin.z) * local_6c0.kstride * 8;
                    lVar79 = (local_c30 - local_6c0.begin.z) * local_6c0.kstride * 8;
                    lVar78 = (local_a48 - local_6c0.begin.y) * local_6c0.jstride * 8;
                    lVar61 = ((long)local_c00 - (long)local_6c0.begin.y) * local_6c0.jstride * 8;
                    lVar38 = (long)local_6c0.begin.x;
                    lVar77 = lVar83 + lVar78 + lVar38 * -8 + local_900;
                    lVar78 = lVar78 + lVar79 + lVar38 * -8 + local_900;
                    lVar83 = lVar83 + lVar61 + lVar38 * -8 + local_900;
                    lVar79 = lVar61 + lVar79 + lVar38 * -8 + local_900;
                    bVar28 = local_c00 == local_980 && local_958 == inflow;
                    local_a10 = (double *)CONCAT71(local_a10._1_7_,bVar28);
                    lVar38 = 0;
                    do {
                      dVar91 = 0.0;
                      if (*(int *)(local_c88 + lVar38 * 4) == 0) {
                        dVar114 = 1.0;
                        dVar91 = dVar114;
                        if (local_86c == Neumann) {
                          if (local_9d0 == lVar38) {
LAB_0069b75e:
                            dVar91 = 0.0;
                          }
                        }
                        else if (local_86c == inflow && local_9d0 == lVar38) goto LAB_0069b75e;
                        dVar107 = dVar114;
                        if (((local_870 == Neumann) || (local_870 == inflow)) &&
                           (local_9d8 == lVar38)) {
                          dVar107 = 0.0;
                        }
                        dVar108 = dVar114;
                        if (local_954 == Neumann) {
                          if (local_c00 == local_a40) {
LAB_0069b7bb:
                            dVar108 = 0.0;
                          }
                        }
                        else if (bVar41) goto LAB_0069b7bb;
                        dVar98 = dVar114;
                        if (local_958 == Neumann) {
                          if (local_c00 == local_980) {
LAB_0069b7f0:
                            dVar98 = 0.0;
                          }
                        }
                        else if (bVar28) goto LAB_0069b7f0;
                        dVar113 = dVar114;
                        if (local_95c == Neumann) {
                          if (local_c30 == local_988) {
LAB_0069b821:
                            dVar113 = 0.0;
                          }
                        }
                        else if (bVar46) goto LAB_0069b821;
                        if (local_960 == Neumann) {
                          if (local_c30 == local_990) {
LAB_0069b85a:
                            dVar114 = 0.0;
                          }
                        }
                        else if (bVar40) goto LAB_0069b85a;
                        dVar3 = *(double *)((long)local_700.p + lVar38 * 8 + lVar48 + -8);
                        dVar85 = *(double *)((long)local_700.p + lVar38 * 8 + lVar48);
                        dVar92 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar78 + -8);
                        dVar100 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar78);
                        dVar93 = *(double *)((long)local_700.p + lVar38 * 8 + lVar82 + -8);
                        dVar93 = dVar93 + dVar93;
                        dVar94 = *(double *)((long)local_700.p + lVar38 * 8 + lVar82);
                        dVar85 = dVar85 + dVar85;
                        dVar94 = dVar94 + dVar94;
                        dVar86 = *(double *)((long)local_700.p + lVar38 * 8 + lVar52 + -8);
                        dVar4 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar79 + -8);
                        dVar86 = dVar86 + dVar86;
                        dVar119 = *(double *)((long)local_700.p + lVar38 * 8 + lVar55 + -8);
                        dVar110 = dVar119 + dVar119 + dVar4;
                        dVar119 = *(double *)((local_a80 - 8) + lVar38 * 8);
                        dVar119 = dVar119 + dVar119;
                        dVar87 = *(double *)((long)local_700.p + lVar38 * 8 + lVar52) * -2.0;
                        dVar5 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar79);
                        dVar105 = *(double *)(local_a80 + lVar38 * 8) * -2.0;
                        dVar88 = *(double *)((long)local_700.p + lVar38 * 8 + lVar35 + -8) * -2.0;
                        dVar6 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar77 + -8);
                        dVar95 = *(double *)((long)local_700.p + lVar38 * 8 + lVar63 + -8) * -2.0;
                        dVar89 = *(double *)((long)local_700.p + lVar38 * 8 + lVar35);
                        dVar89 = dVar89 + dVar89;
                        dVar90 = *(double *)((long)local_700.p + lVar38 * 8 + lVar68);
                        dVar7 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar77);
                        dVar111 = (dVar90 + dVar90) - dVar7;
                        dVar90 = *(double *)((long)local_700.p + lVar38 * 8 + lVar63);
                        dVar90 = dVar90 + dVar90;
                        dVar96 = *(double *)((long)local_700.p + lVar38 * 8 + lVar76 + -8);
                        dVar96 = dVar96 + dVar96;
                        dVar8 = *(double *)((long)local_700.p + lVar38 * 8 + lVar56 + -8);
                        dVar9 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar83 + -8);
                        dVar97 = *(double *)((long)local_700.p + lVar38 * 8 + lVar59 + -8);
                        dVar97 = dVar97 + dVar97;
                        dVar106 = *(double *)((long)local_700.p + lVar38 * 8 + lVar76);
                        dVar106 = dVar106 + dVar106;
                        dVar118 = *(double *)((long)local_700.p + lVar38 * 8 + lVar56);
                        dVar118 = dVar118 + dVar118;
                        dVar10 = *(double *)((long)local_6c0.p + lVar38 * 8 + lVar83);
                        dVar117 = *(double *)((long)local_700.p + lVar38 * 8 + lVar59);
                        dVar117 = dVar117 + dVar117;
                        dVar11 = *(double *)(local_a30 + -8 + lVar38 * 8);
                        dVar115 = *(double *)(local_a30 + lVar38 * 8);
                        dVar115 = dVar115 + dVar115;
                        dVar116 = *(double *)((long)local_700.p + lVar38 * 8 + lVar55);
                        dVar120 = dVar5 - (dVar116 + dVar116);
                        dVar116 = *(double *)((long)local_700.p + lVar38 * 8 + lVar68 + -8) * -2.0 -
                                  dVar6;
                        dVar91 = ((*(double *)(local_968 + lVar38 * 8) * -4.0 +
                                  (dVar118 - dVar10) + dVar106) *
                                  *(double *)(local_ad8 + lVar38 * 8) * dVar107 * dVar98 +
                                 (*(double *)(local_968 + -8 + lVar38 * 8) * 4.0 +
                                 (dVar8 * -2.0 - dVar9) + dVar96) *
                                 *(double *)(local_ad8 + -8 + lVar38 * 8) * dVar91 * dVar98 +
                                 (*(double *)(local_a78 + lVar38 * 8) * 4.0 + (dVar111 - dVar89)) *
                                 *(double *)(local_a68 + lVar38 * 8) * dVar107 * dVar108 +
                                 (*(double *)((local_a78 - 8) + lVar38 * 8) * -4.0 +
                                 dVar116 + dVar88) * *(double *)(local_a68 + -8 + lVar38 * 8) *
                                 dVar91 * dVar108 +
                                 (*(double *)(local_a08 + lVar38 * 8) * 4.0 + dVar120 + dVar87) *
                                 *(double *)(local_ac8 + lVar38 * 8) * dVar107 * dVar98 +
                                 (*(double *)((local_a08 - 8) + lVar38 * 8) * -4.0 +
                                 (dVar110 - dVar86)) * *(double *)(local_ac8 + -8 + lVar38 * 8) *
                                 dVar91 * dVar98 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar73 + -8) * 4.0 +
                                 dVar3 + dVar3 + dVar11 + dVar11 + dVar92) *
                                 *(double *)(local_b48 + -8 + lVar38 * 8) * dVar91 * dVar108 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar73) * -4.0 +
                                 (dVar100 - dVar115) + dVar85) * *(double *)(local_b48 + lVar38 * 8)
                                 * dVar107 * dVar108) * local_630 +
                                 ((*(double *)(local_978 + lVar38 * 8) * -4.0 +
                                  (dVar10 - dVar106) + dVar117) *
                                  *(double *)(local_ad0 + lVar38 * 8) * dVar98 * dVar113 +
                                 (*(double *)(local_978 + -8 + lVar38 * 8) * 4.0 +
                                 ((dVar96 - dVar9) - dVar97)) *
                                 *(double *)(local_ad0 + -8 + lVar38 * 8) * dVar98 * dVar113 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar50) * 4.0 +
                                 dVar89 + dVar7 + dVar90) * *(double *)(local_b28 + lVar38 * 8) *
                                 dVar108 * dVar113 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar50 + -8) * -4.0 +
                                 (dVar88 - dVar6) + dVar95) *
                                 *(double *)(local_b28 + -8 + lVar38 * 8) * dVar108 * dVar113 +
                                 (*(double *)(local_a38 + lVar38 * 8) * 4.0 +
                                 dVar87 + dVar5 + dVar105) *
                                 *(double *)((long)local_b40 + lVar38 * 8) * dVar98 * dVar114 +
                                 (*(double *)((local_a38 - 8) + lVar38 * 8) * -4.0 +
                                 (dVar86 - dVar4) + dVar119) *
                                 *(double *)((long)local_b40 + -8 + lVar38 * 8) * dVar98 * dVar114 +
                                 (*(double *)((local_a28 - 8) + lVar38 * 8) * 4.0 +
                                 (dVar3 * -2.0 - dVar92) + dVar93) *
                                 *(double *)(local_ae0 + -8 + lVar38 * 8) * dVar108 * dVar114 +
                                 (*(double *)(local_a28 + lVar38 * 8) * -4.0 +
                                 ((dVar85 + dVar100) - dVar94)) *
                                 *(double *)(local_ae0 + lVar38 * 8) * dVar108 * dVar114) *
                                 local_620 +
                                 ((*(double *)(local_970 + lVar38 * 8) * -4.0 +
                                  (dVar10 - dVar118) + dVar117) *
                                  *(double *)(local_b20 + lVar38 * 8) * dVar107 * dVar113 +
                                 (*(double *)(local_970 + -8 + lVar38 * 8) * 4.0 +
                                 dVar8 + dVar8 + dVar9 + dVar97) *
                                 *(double *)(local_b20 + -8 + lVar38 * 8) * dVar91 * dVar113 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar60) * 4.0 +
                                 (dVar111 - dVar90)) * *(double *)(local_b30 + lVar38 * 8) * dVar107
                                 * dVar113 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar60 + -8) * -4.0 +
                                 dVar95 + dVar116) * *(double *)(local_b30 + -8 + lVar38 * 8) *
                                 dVar91 * dVar113 +
                                 (*(double *)(local_a70 + lVar38 * 8) * 4.0 + dVar105 + dVar120) *
                                 *(double *)(local_b98 + lVar38 * 8) * dVar107 * dVar114 +
                                 (*(double *)(local_a70 + -8 + lVar38 * 8) * -4.0 +
                                 (dVar110 - dVar119)) * *(double *)(local_b98 + -8 + lVar38 * 8) *
                                 dVar91 * dVar114 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar75 + -8) * 4.0 +
                                 (dVar11 * -2.0 - dVar92) + dVar93) *
                                 *(double *)(local_ae8 + -8 + lVar38 * 8) * dVar91 * dVar114 +
                                 (*(double *)((long)local_700.p + lVar38 * 8 + lVar75) * -4.0 +
                                 (dVar115 - dVar100) + dVar94) * *(double *)(local_ae8 + lVar38 * 8)
                                 * dVar107 * dVar114) * local_628;
                      }
                      local_908[(long)local_9a0 +
                                ((long)local_c00 - local_940) * local_a18 + (lVar38 - local_8f8)] =
                           dVar91;
                      lVar38 = lVar38 + 1;
                    } while ((local_aa8.bigend.vect[0] - local_aa8.smallend.vect[0]) + 1 !=
                             (int)lVar38);
                  }
                  local_c00 = (double *)((long)local_c00 + 1);
                  local_a48 = local_a48 + 1;
                  local_a68 = local_a68 + local_8a8;
                  local_b30 = local_b30 + local_8a8;
                  local_b28 = local_b28 + local_8a8;
                  local_b48 = local_b48 + local_8a8;
                  local_ae8 = local_ae8 + local_8a8;
                  local_ae0 = local_ae0 + local_8a8;
                  local_ad8 = local_ad8 + local_8a8;
                  local_b20 = local_b20 + local_8a8;
                  local_ad0 = local_ad0 + local_8a8;
                  local_ac8 = local_ac8 + local_8a8;
                  local_b98 = local_b98 + local_8a8;
                  local_b40 = (double *)((long)local_b40 + local_8a8);
                  local_c88 = local_c88 + local_9f0;
                } while (local_aa8.bigend.vect[1] + 1U != (int)local_c00);
              }
              local_c30 = local_c30 + 1;
              local_998 = local_998 + 1;
              local_910 = local_910 + local_800;
              local_918 = local_918 + local_800;
              local_8b0 = local_8b0 + local_800;
              local_8b8 = local_8b8 + local_800;
              local_8c0 = local_8c0 + local_800;
              local_8c8 = local_8c8 + local_800;
              local_8d0 = local_8d0 + local_800;
              local_8d8 = local_8d8 + local_800;
              local_8e0 = local_8e0 + local_800;
              local_950 = local_950 + local_800;
              local_888 = local_888 + local_800;
              local_890 = local_890 + local_800;
              local_898 = local_898 + local_7f0;
            } while (local_aa8.bigend.vect[2] + singlevalued != (int)local_c30);
          }
        }
        else {
          local_c48 = (double *)(long)local_aa8.smallend.vect[2];
          if (local_aa8.smallend.vect[2] <= local_aa8.bigend.vect[2]) {
            lVar82 = lVar37 * lVar35;
            lVar63 = (long)local_aa8.smallend.vect[1];
            lVar68 = (long)local_aa8.smallend.vect[0];
            local_a80 = lVar35 * 0x10;
            lVar50 = (local_a80 + (long)local_c48 * 8 + lVar65 * -8) * lVar33;
            lVar60 = (lVar35 * 8 + (long)local_c48 * 8 + lVar65 * -8) * lVar33;
            lVar75 = ((long)local_c48 - lVar65) * lVar33;
            lVar73 = lVar63 * 8 + lVar44 * -8;
            local_a38 = (ulong)(uint)~iVar2;
            local_a68 = (lVar63 * 4 + ((long)local_c48 - local_930) * local_a88 * 4 + local_928 * -4
                        ) * local_a50 + lVar68 * 4 + local_920 * -4 + (long)local_a20;
            local_a28 = local_a88 * local_a50 * 4;
            pdVar51 = pdVar74 + (lVar68 - local_a58);
            local_a30 = lVar33 * 8 * lVar45;
            iVar32 = ~iVar2 + local_aa8.smallend.vect[2];
            local_a70 = (lVar50 + lVar63 * 8 + lVar44 * -8) * lVar45 + lVar68 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_a78 = (lVar60 + lVar63 * 8 + lVar44 * -8) * lVar45 + lVar68 * 8 + local_a58 * -8 +
                        (long)pdVar74;
            local_af0 = (lVar63 * 8 + lVar75 * 8 + lVar44 * -8) * lVar45 + lVar68 * 8 +
                        local_a58 * -8 + (long)pdVar74;
            local_a08 = (ulong)(uint)local_aa8.bigend.vect[1];
            lVar55 = lVar45 * 8;
            local_b40 = pdVar51;
            do {
              if (local_aa8.smallend.vect[1] <= local_aa8.bigend.vect[1]) {
                lVar76 = (long)iVar32;
                lVar52 = (local_a80 + lVar76 * 8) * lVar33;
                lVar77 = (lVar35 * 8 + lVar76 * 8) * lVar33;
                lVar76 = lVar76 * lVar33 * 8;
                local_c60 = (double *)((lVar52 + lVar73) * lVar45 + (long)pdVar51);
                local_c58 = (double *)((lVar73 + lVar77) * lVar45 + (long)pdVar51);
                local_c50 = (double *)((lVar73 + lVar76) * lVar45 + (long)pdVar51);
                lVar78 = (~iVar2 + (int)local_c48) * lVar37;
                lVar59 = ((long)local_c48 - lVar65) * lVar37;
                local_c68 = (double *)local_a70;
                uVar104 = local_a78;
                lVar48 = local_af0;
                lVar56 = local_a68;
                local_c70 = lVar63;
                iVar47 = ~iVar15 + local_aa8.smallend.vect[1];
                do {
                  if (local_aa8.smallend.vect[0] <= local_aa8.bigend.vect[0]) {
                    lVar83 = (long)iVar47;
                    lVar79 = (~iVar15 + (int)local_c70) * lVar45;
                    lVar61 = (local_c70 - lVar44) * lVar45;
                    lVar38 = 0;
                    do {
                      dVar91 = 0.0;
                      if (*(int *)(lVar56 + lVar38 * 4) == 0) {
                        if (local_86c == Neumann) {
                          dVar91 = 1.0;
                          if ((int)local_7e8 - lVar68 == lVar38) {
LAB_0069c8a7:
                            dVar91 = 0.0;
                          }
                        }
                        else {
                          dVar91 = 1.0;
                          if (local_86c == inflow && (int)local_7e8 - lVar68 == lVar38)
                          goto LAB_0069c8a7;
                        }
                        if (((local_870 == Neumann) || (dVar114 = 1.0, local_870 == inflow)) &&
                           (dVar114 = 1.0, aiStack_7dc[0] - lVar68 == lVar38)) {
                          dVar114 = 0.0;
                        }
                        if (local_954 == Neumann) {
                          dVar107 = 1.0;
                          if (local_c70 == local_7e8._4_4_) {
LAB_0069c902:
                            dVar107 = 0.0;
                          }
                        }
                        else {
                          dVar107 = 1.0;
                          if (local_c70 == local_7e8._4_4_ && local_954 == inflow)
                          goto LAB_0069c902;
                        }
                        if (local_958 == Neumann) {
                          dVar108 = 1.0;
                          if (local_c70 == aiStack_7dc[1]) {
LAB_0069c933:
                            dVar108 = 0.0;
                          }
                        }
                        else {
                          dVar108 = 1.0;
                          if (local_c70 == aiStack_7dc[1] && local_958 == inflow) goto LAB_0069c933;
                        }
                        if (local_95c == Neumann) {
                          dVar98 = 1.0;
                          if (local_c48 == (double *)(long)iStack_7e0) {
LAB_0069c964:
                            dVar98 = 0.0;
                          }
                        }
                        else {
                          dVar98 = 1.0;
                          if (local_c48 == (double *)(long)iStack_7e0 && local_95c == inflow)
                          goto LAB_0069c964;
                        }
                        dVar113 = 1.0;
                        if (local_960 == Neumann) {
                          if (local_c48 == (double *)(long)(int)uStack_7d4) {
LAB_0069c99c:
                            dVar113 = 0.0;
                          }
                        }
                        else if (local_c48 == (double *)(long)(int)uStack_7d4 && local_960 == inflow
                                ) goto LAB_0069c99c;
                        lVar84 = (long)(int)(~(uint)local_a58 + local_aa8.smallend.vect[0] +
                                            (int)lVar38);
                        pdVar64 = pdVar74 + lVar79 + lVar84 + lVar78;
                        pdVar70 = pdVar74 + lVar61 + lVar84 + lVar78;
                        pdVar80 = pdVar74 + lVar79 + lVar84 + lVar59;
                        pdVar1 = pdVar74 + lVar61 + lVar84 + lVar59;
                        dVar91 = (dVar114 * *(double *)((long)local_c68 + lVar38 * 8) * dVar108 +
                                 dVar91 * pdVar1[lVar82 * 2] * dVar108 +
                                 *(double *)
                                  ((long)local_b40 + lVar38 * 8 + (lVar50 + lVar83 * 8) * lVar45) *
                                 dVar114 * dVar107 +
                                 pdVar80[lVar82 * 2] * dVar91 * dVar107 +
                                 (((-pdVar64[lVar82 * 2] * dVar91 * dVar107 -
                                   *(double *)
                                    ((long)pdVar51 + lVar38 * 8 + (lVar52 + lVar83 * 8) * lVar45) *
                                   dVar114 * dVar107) - pdVar70[lVar82 * 2] * dVar91 * dVar108) -
                                 local_c60[lVar38] * dVar114 * dVar108)) * local_630 +
                                 (*(double *)(lVar48 + lVar38 * 8) * dVar108 * dVar113 +
                                 ((*(double *)
                                    ((long)local_b40 +
                                    lVar38 * 8 + (lVar75 * 8 + lVar83 * 8) * lVar45) * dVar107 *
                                   dVar113 +
                                  ((local_c50[lVar38] * dVar108 * dVar98 +
                                   ((*(double *)
                                      ((long)pdVar51 + lVar38 * 8 + (lVar76 + lVar83 * 8) * lVar45)
                                     * dVar107 * dVar98 - *pdVar64 * dVar107 * dVar98) -
                                   *pdVar70 * dVar108 * dVar98)) - *pdVar80 * dVar107 * dVar113)) -
                                 *pdVar1 * dVar108 * dVar113)) * local_620 +
                                 (*(double *)(uVar104 + lVar38 * 8) * dVar114 * dVar113 +
                                 pdVar1[lVar82] * dVar91 * dVar113 +
                                 (((local_c58[lVar38] * dVar114 * dVar98 +
                                   pdVar70[lVar82] * dVar91 * dVar98 +
                                   (-pdVar64[lVar82] * dVar91 * dVar98 -
                                   *(double *)
                                    ((long)pdVar51 + lVar38 * 8 + (lVar77 + lVar83 * 8) * lVar45) *
                                   dVar114 * dVar98)) - pdVar80[lVar82] * dVar91 * dVar113) -
                                 *(double *)
                                  ((long)local_b40 + lVar38 * 8 + (lVar60 + lVar83 * 8) * lVar45) *
                                 dVar114 * dVar113)) * local_628;
                      }
                      local_2e0.dptr
                      [((long)local_c48 - local_8e8) * local_948 +
                       (local_c70 - local_940) * local_a18 + ((lVar68 + lVar38) - local_8f8)] =
                           dVar91;
                      lVar38 = lVar38 + 1;
                    } while ((local_aa8.bigend.vect[0] - local_aa8.smallend.vect[0]) + 1 !=
                             (int)lVar38);
                  }
                  local_c70 = local_c70 + 1;
                  lVar56 = lVar56 + local_a50 * 4;
                  iVar47 = iVar47 + 1;
                  local_c68 = (double *)((long)local_c68 + lVar55);
                  uVar104 = uVar104 + lVar55;
                  lVar48 = lVar48 + lVar55;
                  local_c60 = local_c60 + lVar45;
                  local_c58 = local_c58 + lVar45;
                  local_c50 = local_c50 + lVar45;
                } while (local_aa8.bigend.vect[1] + 1U != (int)local_c70);
              }
              local_c48 = (double *)((long)local_c48 + 1);
              local_a68 = local_a68 + local_a28;
              local_b40 = (double *)((long)local_b40 + local_a30);
              iVar32 = iVar32 + 1;
              local_a70 = local_a70 + local_a30;
              local_a78 = local_a78 + local_a30;
              local_af0 = local_af0 + local_a30;
            } while (local_aa8.bigend.vect[2] + singlevalued != (int)local_c48);
          }
        }
        if (local_648 != (FabArray<amrex::FArrayBox> *)0x0) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_6c0,local_648,&local_4a8);
          lVar35 = (long)local_9c8.smallend.vect[2];
          if (local_9c8.smallend.vect[2] <= local_9c8.bigend.vect[2]) {
            iVar32 = (int)uStack_834;
            if (local_9c8.bigend.vect[2] <= (int)uStack_834) {
              iVar32 = local_9c8.bigend.vect[2];
            }
            iVar47 = local_83c[1];
            if (local_9c8.bigend.vect[1] <= local_83c[1]) {
              iVar47 = local_9c8.bigend.vect[1];
            }
            iVar42 = local_83c[0];
            if (local_9c8.bigend.vect[0] <= local_83c[0]) {
              iVar42 = local_9c8.bigend.vect[0];
            }
            iVar30 = local_840;
            if (local_840 <= local_9c8.smallend.vect[2]) {
              iVar30 = local_9c8.smallend.vect[2];
            }
            iVar58 = local_848._4_4_;
            if (local_848._4_4_ <= local_9c8.smallend.vect[1]) {
              iVar58 = local_9c8.smallend.vect[1];
            }
            lVar55 = (long)local_9c8.smallend.vect[0];
            iVar112 = (int)local_848;
            if ((int)local_848 <= local_9c8.smallend.vect[0]) {
              iVar112 = local_9c8.smallend.vect[0];
            }
            do {
              if (local_9c8.smallend.vect[1] <= local_9c8.bigend.vect[1]) {
                lVar60 = (long)local_9c8.smallend.vect[1];
                do {
                  if (local_9c8.smallend.vect[0] <= local_9c8.bigend.vect[0]) {
                    lVar68 = 0;
                    do {
                      dVar91 = 0.0;
                      if ((((long)iVar112 <= lVar55 + lVar68) && (iVar58 <= lVar60)) &&
                         (((iVar30 <= lVar35 &&
                           ((lVar55 + lVar68 <= (long)iVar42 && (lVar60 <= iVar47)))) &&
                          (lVar35 <= iVar32)))) {
                        dVar91 = local_6c0.p
                                 [lVar55 + (((lVar60 - local_6c0.begin.y) * local_6c0.jstride +
                                            (lVar35 - local_6c0.begin.z) * local_6c0.kstride +
                                            lVar68) - (long)local_6c0.begin.x)];
                      }
                      pdVar74[(lVar35 - lVar65) * lVar37 +
                              (lVar60 - lVar44) * lVar45 + ((lVar55 + lVar68) - local_a58)] = dVar91
                      ;
                      lVar68 = lVar68 + 1;
                    } while ((local_9c8.bigend.vect[0] - local_9c8.smallend.vect[0]) + 1 !=
                             (int)lVar68);
                  }
                  lVar60 = lVar60 + 1;
                } while (local_9c8.bigend.vect[1] + 1 != (int)lVar60);
              }
              lVar35 = lVar35 + 1;
            } while (local_9c8.bigend.vect[2] + 1 != (int)lVar35);
          }
          if (local_a5c == singlevalued) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_700,local_818,&local_4a8);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_5b8,&(local_780._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                       &local_4a8);
            local_b48 = (long)local_aa8.smallend.vect[2];
            if (local_aa8.smallend.vect[2] <= local_aa8.bigend.vect[2]) {
              local_a28 = (ulong)(uint)local_aa8.bigend.vect[1];
              local_a30 = (long)local_aa8.smallend.vect[1];
              lVar68 = (long)local_aa8.smallend.vect[0];
              lVar35 = local_a30 * 8;
              lVar55 = lVar68 * 8;
              lVar73 = (lVar35 + (local_b48 - local_8e8) * local_810 * 8 + local_940 * -8) *
                       local_a18 + lVar68 * 8 + local_8f8 * -8 + (long)local_9f8;
              local_a08 = local_a88 * local_a50 * 4;
              local_b28 = local_b48 + -1;
              lVar60 = lVar35 + (local_b28 - lVar65) * lVar33 * 8 + lVar44 * -8;
              lVar35 = lVar35 + (local_b48 - lVar65) * lVar33 * 8 + lVar44 * -8;
              lVar50 = (lVar60 + -8) * lVar45 + lVar68 * 8 + local_a58 * -8 + (long)pdVar74;
              lVar63 = (lVar35 + -8) * lVar45 + lVar68 * 8 + local_a58 * -8 + (long)pdVar74;
              local_a80 = lVar37 * 8;
              lVar35 = lVar45 * 8;
              uVar104 = lVar35 * lVar45 + lVar68 * 8 + local_a58 * -8 + (long)pdVar74;
              lVar60 = lVar60 * lVar45 + lVar68 * 8 + local_a58 * -8 + (long)pdVar74;
              lVar68 = (local_a30 * 4 + (local_b48 - local_930) * local_a88 * 4 + local_928 * -4) *
                       local_a50 + lVar68 * 4 + local_920 * -4 + (long)local_a20;
              do {
                local_a68 = lVar68;
                local_a70 = lVar60;
                local_a78 = uVar104;
                lVar60 = local_a68;
                lVar68 = lVar73;
                local_c70 = lVar50;
                local_c60 = (double *)local_a78;
                local_c58 = (double *)local_a70;
                local_c30 = local_a30;
                local_bb8 = (double *)lVar63;
                local_b40 = (double *)(local_a30 + -1);
                if (local_aa8.smallend.vect[1] <= local_aa8.bigend.vect[1]) {
                  do {
                    if (local_aa8.smallend.vect[0] <= local_aa8.bigend.vect[0]) {
                      lVar48 = (long)local_700.begin.x;
                      lVar75 = (local_b28 - local_700.begin.z) * local_700.kstride * 8;
                      lVar82 = (local_c30 - local_700.begin.y) * local_700.jstride * 8;
                      lVar56 = lVar75 + lVar82 + lVar48 * -8 + lVar55;
                      lVar52 = (local_b48 - local_700.begin.z) * local_700.kstride * 8;
                      lVar59 = lVar82 + lVar52 + lVar48 * -8 + lVar55;
                      lVar82 = ((long)local_b40 - (long)local_700.begin.y) * local_700.jstride * 8;
                      lVar76 = lVar75 + lVar82 + lVar48 * -8 + lVar55;
                      lVar52 = lVar82 + lVar52 + lVar48 * -8 + lVar55;
                      lVar53 = (local_b28 - local_5b8.begin.z) * local_5b8.kstride * 8;
                      lVar49 = (local_c30 - local_5b8.begin.y) * local_5b8.jstride * 8;
                      lVar75 = lVar49 + lVar53;
                      lVar69 = local_5b8.nstride * 0x38;
                      lVar82 = (local_b48 - local_5b8.begin.z) * local_5b8.kstride * 8;
                      lVar49 = lVar49 + lVar82;
                      lVar66 = ((long)local_b40 - (long)local_5b8.begin.y) * local_5b8.jstride * 8;
                      lVar53 = lVar53 + lVar66;
                      lVar66 = lVar66 + lVar82;
                      lVar62 = local_5b8.nstride * 0x10;
                      lVar71 = (long)local_5b8.begin.x;
                      lVar82 = local_5b8.nstride * 0x90;
                      lVar39 = local_5b8.nstride * 0x40;
                      lVar48 = local_5b8.nstride * 0x30;
                      lVar77 = lVar75 + lVar82 + lVar71 * -8 + lVar55;
                      lVar78 = lVar75 + lVar39 + lVar71 * -8 + lVar55;
                      lVar83 = lVar75 + lVar69 + lVar71 * -8 + lVar55;
                      lVar79 = lVar75 + lVar48 + lVar71 * -8 + lVar55;
                      lVar38 = lVar75 + lVar62 + lVar71 * -8 + lVar55;
                      lVar61 = lVar75 + local_5b8.nstride * 8 + lVar71 * -8 + lVar55;
                      lVar75 = lVar75 + lVar71 * -8 + lVar55;
                      lVar84 = lVar49 + lVar82 + lVar71 * -8 + lVar55;
                      lVar54 = lVar49 + lVar39 + lVar71 * -8 + lVar55;
                      lVar57 = lVar49 + lVar69 + lVar71 * -8 + lVar55;
                      lVar67 = lVar49 + lVar48 + lVar71 * -8 + lVar55;
                      lVar81 = lVar49 + lVar62 + lVar71 * -8 + lVar55;
                      lVar16 = lVar49 + local_5b8.nstride * 8 + lVar71 * -8 + lVar55;
                      lVar49 = lVar49 + lVar71 * -8 + lVar55;
                      lVar17 = lVar53 + lVar82 + lVar71 * -8 + lVar55;
                      lVar18 = lVar53 + lVar39 + lVar71 * -8 + lVar55;
                      lVar19 = lVar53 + lVar69 + lVar71 * -8 + lVar55;
                      lVar20 = lVar53 + lVar48 + lVar71 * -8 + lVar55;
                      lVar21 = lVar53 + lVar62 + lVar71 * -8 + lVar55;
                      lVar22 = lVar53 + local_5b8.nstride * 8 + lVar71 * -8 + lVar55;
                      lVar53 = lVar53 + lVar71 * -8 + lVar55;
                      lVar82 = lVar82 + lVar66 + lVar71 * -8 + lVar55;
                      lVar39 = lVar39 + lVar66 + lVar71 * -8 + lVar55;
                      lVar69 = lVar69 + lVar66 + lVar71 * -8 + lVar55;
                      lVar48 = lVar48 + lVar66 + lVar71 * -8 + lVar55;
                      lVar62 = lVar62 + lVar66 + lVar71 * -8 + lVar55;
                      lVar23 = lVar66 + local_5b8.nstride * 8 + lVar71 * -8 + lVar55;
                      lVar66 = lVar66 + lVar71 * -8 + lVar55;
                      lVar71 = 0;
                      do {
                        dVar91 = 0.0;
                        if (*(int *)(lVar60 + lVar71 * 4) == 0) {
                          uVar104 = (ulong)DAT_0077bb00;
                          dVar91 = ((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar20 + -8) +
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar19 + -8) +
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar18 + -8)) * 0.5
                                    + *(double *)((long)local_700.p + lVar71 * 8 + lVar76 + -8) *
                                      0.125 + (*(double *)
                                                ((long)local_5b8.p + lVar71 * 8 + lVar53 + -8) +
                                               *(double *)
                                                ((long)local_5b8.p + lVar71 * 8 + lVar22 + -8) +
                                              *(double *)
                                               ((long)local_5b8.p + lVar71 * 8 + lVar21 + -8)) *
                                              0.25 +
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar17 + -8)) *
                                   *(double *)(local_c70 + -8 + lVar71 * 8) +
                                   (((((double)(*(ulong *)((long)local_5b8.p + lVar71 * 8 + lVar20)
                                               ^ uVar104) -
                                      *(double *)((long)local_5b8.p + lVar71 * 8 + lVar19)) +
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar18)) * 0.5 +
                                    *(double *)((long)local_700.p + lVar71 * 8 + lVar76) * 0.125 +
                                    ((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar22) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar53)) +
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar21)) * 0.25) -
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar17)) *
                                   *(double *)(local_c70 + lVar71 * 8) +
                                   ((((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar83 + -8) -
                                      *(double *)((long)local_5b8.p + lVar71 * 8 + lVar79 + -8)) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar78 + -8)) *
                                     0.5 + *(double *)((long)local_700.p + lVar71 * 8 + lVar56 + -8)
                                           * 0.125 + ((*(double *)
                                                        ((long)local_5b8.p +
                                                        lVar71 * 8 + lVar75 + -8) -
                                                      *(double *)
                                                       ((long)local_5b8.p + lVar71 * 8 + lVar61 + -8
                                                       )) + *(double *)
                                                             ((long)local_5b8.p +
                                                             lVar71 * 8 + lVar38 + -8)) * 0.25) -
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar77 + -8)) *
                                   *(double *)((long)local_c58 + -8 + lVar71 * 8) +
                                   (((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar79) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar83)) -
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar78)) * 0.5 +
                                    *(double *)((long)local_700.p + lVar71 * 8 + lVar56) * 0.125 +
                                    (((double)(*(ulong *)((long)local_5b8.p + lVar71 * 8 + lVar75) ^
                                              uVar104) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar61)) +
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar38)) * 0.25 +
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar77)) *
                                   *(double *)((long)local_c58 + lVar71 * 8) +
                                   ((((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar48 + -8) -
                                      *(double *)((long)local_5b8.p + lVar71 * 8 + lVar69 + -8)) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar39 + -8)) *
                                     0.5 + *(double *)((long)local_700.p + lVar71 * 8 + lVar52 + -8)
                                           * 0.125 + ((*(double *)
                                                        ((long)local_5b8.p +
                                                        lVar71 * 8 + lVar66 + -8) +
                                                      *(double *)
                                                       ((long)local_5b8.p + lVar71 * 8 + lVar23 + -8
                                                       )) - *(double *)
                                                             ((long)local_5b8.p +
                                                             lVar71 * 8 + lVar62 + -8)) * 0.25) -
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar82 + -8)) *
                                   *(double *)((long)local_bb8 + -8 + lVar71 * 8) +
                                   (((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar69) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar48)) -
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar39)) * 0.5 +
                                    *(double *)((long)local_700.p + lVar71 * 8 + lVar52) * 0.125 +
                                    ((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar23) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar66)) -
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar62)) * 0.25 +
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar82)) *
                                   *(double *)((long)local_bb8 + lVar71 * 8) +
                                   (((*(double *)((long)local_5b8.p + lVar71 * 8 + lVar67) +
                                      *(double *)((long)local_5b8.p + lVar71 * 8 + lVar57) +
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar54)) * 0.5 +
                                    *(double *)((long)local_700.p + lVar71 * 8 + lVar59) * 0.125 +
                                    (((double)(*(ulong *)((long)local_5b8.p + lVar71 * 8 + lVar49) ^
                                              uVar104) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar16)) -
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar81)) * 0.25) -
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar84)) *
                                   *(double *)((long)local_c60 + lVar71 * 8) +
                                   ((((double)(*(ulong *)((long)local_5b8.p +
                                                         lVar71 * 8 + lVar67 + -8) ^ uVar104) -
                                     *(double *)((long)local_5b8.p + lVar71 * 8 + lVar57 + -8)) +
                                    *(double *)((long)local_5b8.p + lVar71 * 8 + lVar54 + -8)) * 0.5
                                    + *(double *)((long)local_700.p + lVar71 * 8 + lVar59 + -8) *
                                      0.125 + ((*(double *)
                                                 ((long)local_5b8.p + lVar71 * 8 + lVar49 + -8) -
                                               *(double *)
                                                ((long)local_5b8.p + lVar71 * 8 + lVar16 + -8)) -
                                              *(double *)
                                               ((long)local_5b8.p + lVar71 * 8 + lVar81 + -8)) *
                                              0.25 +
                                   *(double *)((long)local_5b8.p + lVar71 * 8 + lVar84 + -8)) *
                                   *(double *)(((long)local_c60 - 8U) + lVar71 * 8);
                        }
                        *(double *)(lVar68 + lVar71 * 8) = dVar91 + *(double *)(lVar68 + lVar71 * 8)
                        ;
                        lVar71 = lVar71 + 1;
                      } while ((local_aa8.bigend.vect[0] - local_aa8.smallend.vect[0]) + 1 !=
                               (int)lVar71);
                    }
                    local_c30 = local_c30 + 1;
                    lVar68 = lVar68 + local_a18 * 8;
                    lVar60 = lVar60 + local_a50 * 4;
                    local_c58 = (double *)((long)local_c58 + lVar35);
                    local_c60 = (double *)((long)local_c60 + lVar35);
                    local_c70 = local_c70 + lVar35;
                    local_bb8 = (double *)((long)local_bb8 + lVar35);
                    local_b40 = (double *)((long)local_b40 + 1);
                  } while (local_aa8.bigend.vect[1] + 1U != (int)local_c30);
                }
                local_b48 = local_b48 + 1;
                lVar73 = lVar73 + local_948 * 8;
                lVar50 = lVar50 + local_a80;
                lVar63 = lVar63 + local_a80;
                local_b28 = local_b28 + 1;
                uVar104 = local_a78 + local_a80;
                lVar60 = local_a70 + local_a80;
                lVar68 = local_a68 + local_a08;
              } while (local_aa8.bigend.vect[2] + singlevalued != (int)local_b48);
            }
          }
          else {
            local_c38 = (long)local_aa8.smallend.vect[2];
            if (local_aa8.smallend.vect[2] <= local_aa8.bigend.vect[2]) {
              lVar50 = (long)local_aa8.smallend.vect[1];
              lVar60 = (long)local_aa8.smallend.vect[0];
              lVar35 = lVar50 * 8;
              local_c10 = ((local_c38 - local_8e8) * local_810 * 8 + lVar35 + local_940 * -8) *
                          local_a18 + lVar60 * 8 + local_8f8 * -8 + (long)local_9f8;
              local_c48 = (double *)
                          ((lVar50 * 4 + (local_c38 - local_930) * local_a88 * 4 + local_928 * -4) *
                           local_a50 + lVar60 * 4 + local_920 * -4 + (long)local_a20);
              pdVar51 = pdVar74 + (lVar60 - local_a58);
              lVar55 = lVar33 * 8 * lVar45;
              lVar68 = (local_c38 - lVar65) * lVar33;
              iVar32 = ~iVar2 + local_aa8.smallend.vect[2];
              local_c18 = (double *)
                          ((lVar68 * 8 + lVar35 + lVar44 * -8) * lVar45 + lVar60 * 8 +
                           local_a58 * -8 + (long)pdVar74);
              local_c68 = pdVar51;
              do {
                if (local_aa8.smallend.vect[1] <= local_aa8.bigend.vect[1]) {
                  lVar73 = (long)iVar32 * lVar33 * 8;
                  pdVar70 = (double *)((lVar35 + lVar44 * -8 + lVar73) * lVar45 + (long)pdVar51);
                  lVar82 = (~iVar2 + (int)local_c38) * lVar37;
                  lVar75 = (local_c38 - lVar65) * lVar37;
                  lVar60 = local_c10;
                  pdVar64 = local_c48;
                  pdVar80 = local_c18;
                  lVar63 = lVar50;
                  iVar47 = ~iVar15 + local_aa8.smallend.vect[1];
                  do {
                    if (local_aa8.smallend.vect[0] <= local_aa8.bigend.vect[0]) {
                      lVar48 = (~iVar15 + (int)lVar63) * lVar45;
                      lVar56 = (lVar63 - lVar44) * lVar45;
                      lVar59 = 0;
                      do {
                        dVar91 = 0.0;
                        if (*(int *)((long)pdVar64 + lVar59 * 4) == 0) {
                          lVar76 = (long)(int)(~(uint)local_a58 + local_aa8.smallend.vect[0] +
                                              (int)lVar59);
                          dVar91 = (pdVar74[lVar48 + lVar76 + lVar82] +
                                    *(double *)
                                     ((long)pdVar51 +
                                     lVar59 * 8 + (lVar73 + (long)iVar47 * 8) * lVar45) +
                                    pdVar74[lVar56 + lVar76 + lVar82] + pdVar70[lVar59] +
                                    pdVar74[lVar48 + lVar76 + lVar75] +
                                    *(double *)
                                     ((long)local_c68 +
                                     lVar59 * 8 + (lVar68 * 8 + (long)iVar47 * 8) * lVar45) +
                                    pdVar74[lVar56 + lVar76 + lVar75] +
                                   *(double *)((long)pdVar80 + lVar59 * 8)) * 0.125;
                        }
                        *(double *)(lVar60 + lVar59 * 8) = dVar91 + *(double *)(lVar60 + lVar59 * 8)
                        ;
                        lVar59 = lVar59 + 1;
                      } while ((local_aa8.bigend.vect[0] - local_aa8.smallend.vect[0]) + 1 !=
                               (int)lVar59);
                    }
                    lVar63 = lVar63 + 1;
                    lVar60 = lVar60 + local_a18 * 8;
                    pdVar64 = (double *)((long)pdVar64 + local_a50 * 4);
                    iVar47 = iVar47 + 1;
                    pdVar80 = (double *)((long)pdVar80 + lVar45 * 8);
                    pdVar70 = pdVar70 + lVar45;
                  } while (local_aa8.bigend.vect[1] + 1U != (int)lVar63);
                }
                local_c38 = local_c38 + 1;
                local_c10 = local_c10 + local_948 * 8;
                local_c48 = (double *)((long)local_c48 + local_a88 * local_a50 * 4);
                local_c68 = (double *)((long)local_c68 + lVar55);
                iVar32 = iVar32 + 1;
                local_c18 = (double *)((long)local_c18 + lVar55);
              } while (local_aa8.bigend.vect[2] + singlevalued != (int)local_c38);
            }
          }
        }
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_6c0,local_650,&local_4a8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_700,local_520,&local_4a8);
        if (local_a5c == singlevalued) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_5b8,(FabArray<amrex::FArrayBox> *)*local_658,&local_4a8);
          local_794 = local_aa8.bigend.vect[2];
          iStack_79c = local_aa8.bigend.vect[0];
          local_798 = local_aa8.bigend.vect[1];
          local_7a8 = (EBCellFlag *)
                      CONCAT44(local_aa8.smallend.vect[1] + -1,local_aa8.smallend.vect[0] + -1);
          FStack_7a0 = local_aa8.smallend.vect[2] + covered;
          local_578.kstride._0_4_ = local_aa8.bigend.vect[1];
          local_578.kstride._4_4_ = local_aa8.bigend.vect[2];
          local_578.jstride._4_4_ = local_aa8.bigend.vect[0];
          lVar33 = 0;
          do {
            if ((local_aa8.btype.itype >> ((uint)lVar33 & 0x1f) & 1) != 0) {
              piVar34 = (int *)((long)&local_578.jstride + lVar33 * 4 + 4);
              *piVar34 = *piVar34 + -1;
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 != 3);
          local_578.nstride._0_4_ = 0;
          local_7c8.btype.itype = 0;
          local_7c8.smallend.vect[2] = local_aa8.smallend.vect[2] + ~singlevalued;
          local_7c8.bigend.vect[0] = local_578.jstride._4_4_ + 1;
          local_7c8.smallend.vect[1] = local_aa8.smallend.vect[1] + -2;
          local_7c8.smallend.vect[0] = local_aa8.smallend.vect[0] + -2;
          local_7c8.bigend.vect[1] = (uint)local_578.kstride + 1;
          local_7c8.bigend.vect[2] = local_578.kstride._4_4_ + singlevalued;
          local_578.p = local_7a8;
          local_578.jstride._0_4_ = FStack_7a0;
          FArrayBox::resize((FArrayBox *)&local_3b8,(Box *)&local_7a8,9,(Arena *)0x0);
          DVar36.m_arena = local_3b8.super_DataAllocator.m_arena;
          if (local_3b8.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar36.m_arena = The_Arena();
          }
          Gpu::Elixir::Elixir(&local_138,(void *)0x0,DVar36.m_arena);
          iVar42 = local_3b8.domain.bigend.vect[2];
          iVar47 = local_3b8.domain.bigend.vect[1];
          iVar32 = local_3b8.domain.bigend.vect[0];
          iVar2 = local_3b8.domain.smallend.vect[1];
          iVar15 = local_3b8.domain.smallend.vect[0];
          local_660 = local_3b8.dptr;
          lVar33 = (long)local_3b8.domain.smallend.vect[0];
          lVar37 = (long)local_3b8.domain.smallend.vect[1];
          local_778 = (long)local_3b8.domain.smallend.vect[2];
          FArrayBox::resize((FArrayBox *)&local_400,&local_7c8,0x1c,(Arena *)0x0);
          DVar36.m_arena = local_400.super_DataAllocator.m_arena;
          if (local_400.super_DataAllocator.m_arena == (Arena *)0x0) {
            DVar36.m_arena = The_Arena();
          }
          local_668 = (long)((iVar32 - iVar15) + 1);
          local_788 = (long)((iVar47 - iVar2) + 1);
          local_680 = (long)((iVar42 - (int)local_778) + 1);
          Gpu::Elixir::Elixir(&local_60,(void *)0x0,DVar36.m_arena);
          iVar32 = local_400.domain.smallend.vect[2];
          iVar2 = local_400.domain.smallend.vect[1];
          iVar15 = local_400.domain.smallend.vect[0];
          local_9a0 = local_400.dptr;
          lVar55 = (long)local_400.domain.smallend.vect[0];
          lVar45 = (long)local_400.domain.smallend.vect[1];
          lVar60 = (long)local_400.domain.smallend.vect[2];
          lVar65 = (long)((local_400.domain.bigend.vect[0] - local_400.domain.smallend.vect[0]) + 1)
          ;
          local_808 = (long)((local_400.domain.bigend.vect[1] - local_400.domain.smallend.vect[1]) +
                            1);
          local_950 = (long)((local_400.domain.bigend.vect[2] - local_400.domain.smallend.vect[2]) +
                            1);
          local_8f0 = local_808 * lVar65;
          lVar44 = local_950 * local_8f0;
          local_900 = lVar44 * 0xd8;
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_578,local_770,&local_4a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_5f8,local_818,&local_4a8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_760,&(local_780._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                     &local_4a8);
          BATransformer::operator()
                    (&local_98,&((local_4a8.fabArray)->boxarray).m_bat,
                     (Box *)((long)((local_4a8.index_map)->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[local_4a8.currentIndex] * 0x1c +
                            *(long *)&((((local_4a8.fabArray)->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          auVar26 = _DAT_007a40b0;
          auVar25 = _DAT_0077bb40;
          auVar24 = _DAT_0077bb30;
          local_60c[1] = local_98.bigend.vect[1];
          local_60c[2] = local_98.bigend.vect[2];
          local_60c[3] = local_98.btype.itype;
          local_618 = local_98.smallend.vect[0];
          local_614 = local_98.smallend.vect[1];
          uVar27 = _local_618;
          local_60c[0] = local_98.bigend.vect[0];
          lVar35 = 0;
          do {
            if (((uint)local_60c[3] >> ((uint)lVar35 & 0x1f) & 1) != 0) {
              local_60c[lVar35] = local_60c[lVar35] + -1;
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != 3);
          local_900 = local_900 + (long)local_9a0;
          local_c88 = (long)local_7c8.smallend.vect[2];
          if (local_7c8.smallend.vect[2] <= local_7c8.bigend.vect[2]) {
            lVar35 = (long)local_7c8.smallend.vect[0];
            local_8a8 = (ulong)local_7c8.smallend.vect[1];
            local_618 = local_98.smallend.vect[0];
            iVar47 = local_60c[2];
            if (local_7c8.bigend.vect[2] < local_60c[2]) {
              iVar47 = local_7c8.bigend.vect[2];
            }
            iVar42 = local_60c[1];
            if (local_7c8.bigend.vect[1] < local_60c[1]) {
              iVar42 = local_7c8.bigend.vect[1];
            }
            if (local_7c8.bigend.vect[0] < local_60c[0]) {
              local_60c[0] = local_7c8.bigend.vect[0];
            }
            iVar30 = local_98.smallend.vect[2];
            if (local_98.smallend.vect[2] < local_7c8.smallend.vect[2]) {
              iVar30 = local_7c8.smallend.vect[2];
            }
            local_614 = local_98.smallend.vect[1];
            if (local_614 < local_7c8.smallend.vect[1]) {
              local_614 = local_7c8.smallend.vect[1];
            }
            if (local_618 < local_7c8.smallend.vect[0]) {
              local_618 = local_7c8.smallend.vect[0];
            }
            lVar68 = lVar44 * 0x10;
            local_a28 = lVar44 * 0x20;
            local_a30 = lVar44 * 0x40;
            local_a08 = lVar44 * 0x18;
            local_a80 = lVar44 * 0x48;
            local_908 = (double *)CONCAT44(local_908._4_4_,local_7c8.bigend.vect[2] + 1);
            local_9f0 = ((local_950 * 8 + local_c88 * 8 + lVar60 * -8) * local_808 + local_8a8 * 8 +
                        lVar45 * -8) * lVar65 + lVar35 * 8 + lVar55 * -8 + (long)local_9a0;
            local_ba0 = (local_8a8 * 8 + (local_c88 - lVar60) * local_808 * 8 + lVar45 * -8) *
                        lVar65 + lVar35 * 8 + lVar55 * -8 + (long)local_9a0;
            local_a38 = lVar44 * 0x30;
            local_968 = lVar44 * 0x38;
            local_970 = lVar44 * 0x50;
            local_978 = lVar44 * 0x58;
            local_9d0 = lVar44 * 0x60;
            local_9d8 = lVar44 * 0x68;
            local_a10 = (double *)(lVar44 * 0x70);
            local_a40 = (double *)(lVar44 * 0x78);
            local_980 = (double *)(lVar44 * 0x88);
            local_938 = lVar44 * 0x90;
            local_988 = lVar44 * 0x98;
            local_990 = lVar44 * 0xa0;
            local_9e0 = lVar44 * 0xa8;
            local_9e8 = lVar44 * 0xb0;
            local_a48 = lVar44 * 0xb8;
            local_998 = lVar44 * 0xd0;
            do {
              if (local_7c8.smallend.vect[1] <= local_7c8.bigend.vect[1]) {
                lVar50 = (local_c88 - lVar60) * local_8f0;
                local_878 = local_9a0 + lVar50;
                local_880 = local_900 + lVar50 * 8;
                local_c30 = local_ba0;
                local_b40 = (double *)local_9f0;
                uVar104 = local_8a8;
                do {
                  if (local_7c8.smallend.vect[0] <= local_7c8.bigend.vect[0]) {
                    lVar82 = (uVar104 - (long)local_5f8.begin.y) * local_5f8.jstride;
                    lVar75 = (local_c88 - local_5f8.begin.z) * local_5f8.kstride;
                    lVar73 = local_760.jstride * (uVar104 - (long)local_760.begin.y);
                    lVar56 = (local_c88 - local_760.begin.z) * local_760.kstride;
                    lVar48 = (uVar104 - lVar45) * lVar65;
                    local_a68 = local_760.nstride * 0x70;
                    local_a70 = local_760.nstride * 0x88;
                    lVar50 = lVar35;
                    pdVar74 = local_b40;
                    lVar63 = local_c30;
                    do {
                      iVar58 = auVar26._0_4_;
                      iVar112 = auVar26._4_4_;
                      if ((((lVar50 < local_618) || ((long)uVar104 < (long)local_614)) ||
                          (local_c88 < iVar30)) ||
                         (((local_60c[0] < lVar50 || ((long)iVar42 < (long)uVar104)) ||
                          (iVar47 < local_c88)))) {
                        lVar59 = 0x1c;
                        lVar76 = 0;
                        auVar102 = auVar24;
                        do {
                          if (SUB164(auVar102 ^ auVar25,4) == iVar112 &&
                              SUB164(auVar102 ^ auVar25,0) < iVar58) {
                            *(undefined8 *)(lVar63 + lVar76) = 0;
                            *(undefined8 *)((long)pdVar74 + lVar76) = 0;
                          }
                          lVar52 = auVar102._8_8_;
                          auVar102._0_8_ = auVar102._0_8_ + 2;
                          auVar102._8_8_ = lVar52 + 2;
                          lVar76 = lVar76 + lVar68;
                          lVar59 = lVar59 + -2;
                        } while (lVar59 != 0);
                        dVar91 = 0.0;
                      }
                      else {
                        uVar43 = local_578.p
                                 [(uVar104 - (long)local_578.begin.y) *
                                  CONCAT44(local_578.jstride._4_4_,(FabType)local_578.jstride) +
                                  (local_c88 - local_578.begin.z) *
                                  CONCAT44(local_578.kstride._4_4_,(uint)local_578.kstride) +
                                  (lVar50 - local_578.begin.x)].flag & 3;
                        if (uVar43 == 0) {
LAB_0069f91f:
                          lVar59 = 0x1c;
                          lVar76 = 0;
                          auVar103 = auVar24;
                          do {
                            if (SUB164(auVar103 ^ auVar25,4) == iVar112 &&
                                SUB164(auVar103 ^ auVar25,0) < iVar58) {
                              *(undefined8 *)(lVar63 + lVar76) = 0x3ff0000000000000;
                              *(undefined8 *)((long)pdVar74 + lVar76) = 0x3ff0000000000000;
                            }
                            lVar52 = auVar103._8_8_;
                            auVar103._0_8_ = auVar103._0_8_ + 2;
                            auVar103._8_8_ = lVar52 + 2;
                            lVar76 = lVar76 + lVar68;
                            lVar59 = lVar59 + -2;
                          } while (lVar59 != 0);
                        }
                        else if (uVar43 == 3) {
                          lVar59 = 0x1c;
                          lVar76 = 0;
                          auVar101 = auVar24;
                          do {
                            if (SUB164(auVar101 ^ auVar25,4) == iVar112 &&
                                SUB164(auVar101 ^ auVar25,0) < iVar58) {
                              *(undefined8 *)(lVar63 + lVar76) = 0;
                              *(undefined8 *)((long)pdVar74 + lVar76) = 0;
                            }
                            lVar52 = auVar101._8_8_;
                            auVar101._0_8_ = auVar101._0_8_ + 2;
                            auVar101._8_8_ = lVar52 + 2;
                            lVar76 = lVar76 + lVar68;
                            lVar59 = lVar59 + -2;
                          } while (lVar59 != 0);
                        }
                        else {
                          lVar59 = lVar50 - local_5f8.begin.x;
                          if (0.9999999999999778 <= local_5f8.p[lVar82 + lVar59 + lVar75])
                          goto LAB_0069f91f;
                          lVar76 = lVar50 - local_760.begin.x;
                          uVar109 = (ulong)DAT_0077bb00;
                          lVar52 = lVar50 - lVar55;
                          local_878[lVar48 + lVar52] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 6] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 9]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               9.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 0.5625 +
                                     (((double)((ulong)local_760.p[lVar73 + lVar56 + lVar76] ^
                                               uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride]) +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               18.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 1.125 +
                                      ((local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 3] -
                                       local_760.p[lVar73 + lVar56 + lVar76]) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4])
                                      * 4.5;
                          local_878[lVar48 + lVar52 + lVar44 * 2] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 9] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 6]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               9.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 0.5625 +
                                     ((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride] -
                                      local_760.p[lVar73 + lVar56 + lVar76]) +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 3] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 9] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               18.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 1.125 +
                                      (((double)((ulong)local_760.p
                                                        [lVar73 + lVar56 + lVar76 + local_760.
                                                                                    nstride] ^
                                                uVar109) -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) + local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 4]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 4] =
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf] *
                               36.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 2.25 +
                                      ((double)((ulong)local_760.p
                                                       [lVar73 + lVar56 + lVar76 + local_760.nstride
                                                                                   * 3] ^ uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4])
                                      * 9.0;
                          local_878[lVar48 + lVar52 + lVar44 * 5] =
                               ((double)((ulong)local_760.p
                                                [lVar73 + lVar56 + lVar76 + local_760.nstride * 9] ^
                                        uVar109) -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               18.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 1.125 +
                                      ((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride] -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) + local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 4]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 6] =
                               (((double)((ulong)local_760.p
                                                 [lVar73 + lVar56 + lVar76 + local_760.nstride * 6]
                                         ^ uVar109) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 9]) +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb] +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               9.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 0.5625 +
                                     ((local_760.p[lVar73 + lVar56 + lVar76] -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride]) +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 7] =
                               ((double)((ulong)local_760.p
                                                [lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb]
                                        ^ uVar109) -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               18.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 1.125 +
                                      ((local_760.p[lVar73 + lVar56 + lVar76] +
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) - local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 4]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 8] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 6] +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 9] +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xb] +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xf]) *
                               9.0 + local_5f8.p[lVar82 + lVar59 + lVar75] * 0.5625 +
                                     (local_760.p[lVar73 + lVar56 + lVar76] +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride] +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 9] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 7] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 10]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     (((double)((ulong)local_760.p[lVar73 + lVar56 + lVar76] ^
                                               uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2])
                                      + local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 3] +
                                     local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                     * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 10] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      ((local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 3] -
                                       local_760.p[lVar73 + lVar56 + lVar76]) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                      * 4.5;
                          local_878[lVar48 + lVar52 + lVar44 * 0xb] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 10] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 7]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     ((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2]
                                      - local_760.p[lVar73 + lVar56 + lVar76]) +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 0xc] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 10] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      (((double)((ulong)local_760.p
                                                        [lVar73 + lVar56 + lVar76 + local_760.
                                                                                    nstride * 2] ^
                                                uVar109) -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) + local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 5]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 0xd] =
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10] *
                               36.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 2.25 +
                                      ((double)((ulong)local_760.p
                                                       [lVar73 + lVar56 + lVar76 + local_760.nstride
                                                                                   * 3] ^ uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                      * 9.0;
                          local_878[lVar48 + lVar52 + lVar44 * 0xe] =
                               ((double)((ulong)local_760.p
                                                [lVar73 + lVar56 + lVar76 + local_760.nstride * 10]
                                        ^ uVar109) -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      ((local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 2] -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) + local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 5]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 0xf] =
                               (((double)((ulong)local_760.p
                                                 [lVar73 + lVar56 + lVar76 + local_760.nstride * 7]
                                         ^ uVar109) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 10]) +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd] +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     ((local_760.p[lVar73 + lVar56 + lVar76] -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2])
                                      + local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 3] +
                                     local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                     * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 0x10] =
                               ((double)((ulong)local_760.p
                                                [lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd]
                                        ^ uVar109) -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      ((local_760.p[lVar73 + lVar56 + lVar76] +
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 3]
                                       ) - local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 5]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 0x11] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 7] +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 10] +
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xd] +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x10]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     (local_760.p[lVar73 + lVar56 + lVar76] +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2]
                                      + local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 3] +
                                     local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                     * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 0x12] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 8] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xc]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xe]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x11]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     (((double)((ulong)local_760.p
                                                       [lVar73 + lVar56 + lVar76 + local_760.nstride
                                                       ] ^ uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2])
                                      + local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 4] +
                                     local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                     * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 0x13] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xe] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x11]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      ((local_760.p
                                        [lVar73 + lVar56 + lVar76 + local_760.nstride * 4] -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride]) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                      * 4.5;
                          local_878[lVar48 + lVar52 + lVar44 * 0x14] =
                               (((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xc] -
                                 local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 8]) -
                                local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xe]) +
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x11]) *
                               9.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 0.5625 +
                                     ((local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 2]
                                      - local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride]) +
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                     + local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5]
                                     ) * 2.25;
                          local_878[lVar48 + lVar52 + lVar44 * 0x15] =
                               (local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0xc] -
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x11]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      (((double)((ulong)local_760.p
                                                        [lVar73 + lVar56 + lVar76 + local_760.
                                                                                    nstride * 2] ^
                                                uVar109) -
                                       local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 4]
                                       ) + local_760.p
                                           [lVar73 + lVar56 + lVar76 + local_760.nstride * 5]) * 4.5
                          ;
                          local_878[lVar48 + lVar52 + lVar44 * 0x16] =
                               local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 0x11] *
                               36.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 2.25 +
                                      ((double)((ulong)local_760.p
                                                       [lVar73 + lVar56 + lVar76 + local_760.nstride
                                                                                   * 4] ^ uVar109) -
                                      local_760.p[lVar73 + lVar56 + lVar76 + local_760.nstride * 5])
                                      * 9.0;
                          lVar77 = local_760.jstride * (uVar104 - (long)local_760.begin.y);
                          lVar78 = (local_c88 - local_760.begin.z) * local_760.kstride;
                          local_878[lVar48 + lVar52 + lVar44 * 0x17] =
                               ((double)((ulong)local_760.p
                                                [lVar77 + lVar76 + lVar78 + local_760.nstride * 0xc]
                                        ^ uVar109) -
                               local_760.p[lVar77 + lVar76 + lVar78 + local_760.nstride * 0x11]) *
                               18.0 + local_5f8.p[lVar82 + lVar75 + lVar59] * 1.125 +
                                      ((local_760.p
                                        [lVar77 + lVar76 + lVar78 + local_760.nstride * 2] -
                                       local_760.p[lVar77 + lVar76 + lVar78 + local_760.nstride * 4]
                                       ) + local_760.p
                                           [lVar77 + lVar76 + lVar78 + local_760.nstride * 5]) * 4.5
                          ;
                          lVar77 = (uVar104 - (long)local_760.begin.y) * local_760.jstride;
                          lVar76 = lVar50 - local_760.begin.x;
                          lVar59 = (local_c88 - local_760.begin.z) * local_760.kstride;
                          local_878[lVar48 + lVar52 + lVar44 * 0x18] =
                               (((double)((ulong)local_760.p
                                                 [lVar77 + lVar76 + lVar59 + local_760.nstride * 8]
                                         ^ uVar109) -
                                local_760.p[lVar77 + lVar76 + lVar59 + local_760.nstride * 0xc]) +
                                local_760.p[lVar77 + lVar76 + lVar59 + local_760.nstride * 0xe] +
                               local_760.p[lVar77 + lVar76 + lVar59 + local_760.nstride * 0x11]) *
                               9.0 + local_5f8.p
                                     [(uVar104 - (long)local_5f8.begin.y) * local_5f8.jstride +
                                      (lVar50 - local_5f8.begin.x) +
                                      (local_c88 - local_5f8.begin.z) * local_5f8.kstride] * 0.5625
                                     + ((local_760.p[lVar77 + lVar76 + lVar59 + local_760.nstride] -
                                        local_760.p
                                        [lVar77 + lVar76 + lVar59 + local_760.nstride * 2]) +
                                        local_760.p
                                        [lVar77 + lVar76 + lVar59 + local_760.nstride * 4] +
                                       local_760.p[lVar77 + lVar76 + lVar59 + local_760.nstride * 5]
                                       ) * 2.25;
                          lVar77 = (uVar104 - (long)local_760.begin.y) * local_760.jstride;
                          lVar59 = lVar50 - local_760.begin.x;
                          lVar76 = (local_c88 - local_760.begin.z) * local_760.kstride;
                          local_878[lVar48 + lVar52 + lVar44 * 0x19] =
                               ((double)((ulong)local_760.p
                                                [lVar77 + lVar59 + lVar76 + local_760.nstride * 0xe]
                                        ^ uVar109) -
                               local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 0x11]) *
                               18.0 + local_5f8.p
                                      [(uVar104 - (long)local_5f8.begin.y) * local_5f8.jstride +
                                       (lVar50 - local_5f8.begin.x) +
                                       (local_c88 - local_5f8.begin.z) * local_5f8.kstride] * 1.125
                                      + ((local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride]
                                         + local_760.p
                                           [lVar77 + lVar59 + lVar76 + local_760.nstride * 4]) -
                                        local_760.p
                                        [lVar77 + lVar59 + lVar76 + local_760.nstride * 5]) * 4.5;
                          lVar77 = (uVar104 - (long)local_760.begin.y) * local_760.jstride;
                          lVar59 = lVar50 - local_760.begin.x;
                          lVar76 = (local_c88 - local_760.begin.z) * local_760.kstride;
                          local_878[lVar48 + lVar52 + lVar44 * 0x1a] =
                               (local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 8] +
                                local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 0xc] +
                                local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 0xe] +
                               local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 0x11]) *
                               9.0 + local_5f8.p
                                     [(uVar104 - (long)local_5f8.begin.y) * local_5f8.jstride +
                                      (lVar50 - local_5f8.begin.x) +
                                      (local_c88 - local_5f8.begin.z) * local_5f8.kstride] * 0.5625
                                     + (local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride] +
                                        local_760.p
                                        [lVar77 + lVar59 + lVar76 + local_760.nstride * 2] +
                                        local_760.p
                                        [lVar77 + lVar59 + lVar76 + local_760.nstride * 4] +
                                       local_760.p[lVar77 + lVar59 + lVar76 + local_760.nstride * 5]
                                       ) * 2.25;
                        }
                        dVar91 = local_5b8.p
                                 [(uVar104 - (long)local_5b8.begin.y) * local_5b8.jstride +
                                  (lVar50 - local_5b8.begin.x) +
                                  (local_c88 - local_5b8.begin.z) * local_5b8.kstride];
                      }
                      *(double *)(local_880 + lVar48 * 8 + (lVar50 - lVar55) * 8) = dVar91;
                      lVar50 = lVar50 + 1;
                      pdVar74 = (double *)((long)pdVar74 + 8);
                      lVar63 = lVar63 + 8;
                      local_a78 = uVar104;
                    } while (local_7c8.bigend.vect[0] + 1 != (int)lVar50);
                  }
                  uVar104 = uVar104 + 1;
                  local_b40 = (double *)((long)local_b40 + lVar65 * 8);
                  local_c30 = local_c30 + lVar65 * 8;
                } while (local_7c8.bigend.vect[1] + 1 != (int)uVar104);
              }
              local_c88 = local_c88 + 1;
              local_9f0 = local_9f0 + local_8f0 * 8;
              local_ba0 = local_ba0 + local_8f0 * 8;
            } while (local_7c8.bigend.vect[2] + 1 != (int)local_c88);
          }
          local_9f0 = (long)FStack_7a0;
          local_a5c = local_794;
          if (FStack_7a0 <= local_794) {
            lVar63 = (long)local_7a8._4_4_;
            local_4c0 = lVar63 * 8 + lVar45 * -8;
            local_4c8 = local_950 * 0xd8;
            lVar68 = local_9f0 * 8;
            lVar50 = (local_4c8 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_638 = local_950 * 0x20;
            local_998 = (local_950 * 0x68 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_878 = (double *)((local_950 * 0x50 + local_9f0 * 8 + lVar60 * -8) * local_808);
            local_640 = local_950 * 8;
            local_4d0 = local_950 * 0x18;
            local_880 = (local_950 * 0x60 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_968 = (long)(int)local_7a8;
            local_4d8 = local_950 * 0x58;
            local_4e0 = local_950 * 0xb8;
            local_4e8 = local_950 * 0x70;
            local_4f0 = local_950 * 0xd0;
            local_4f8 = local_950 * 0x28;
            lVar35 = local_9f0 * 8;
            uVar43 = ~iVar2;
            local_8a8 = (ulong)uVar43;
            uVar31 = ~iVar32;
            local_500 = (ulong)uVar31;
            local_a70 = lVar44 * 7;
            local_a78 = lVar44 * 0x17;
            local_a28 = lVar44 * 0x19;
            local_a30 = lVar44 * 0x40;
            local_a08 = lVar44 * 0x78;
            local_a5c = local_794 + singlevalued;
            local_a40 = local_9a0 + (local_968 - lVar55);
            local_800 = CONCAT44(local_800._4_4_,~iVar32 + FStack_7a0);
            local_908 = (double *)
                        ((lVar50 + lVar63 * 8 + lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8
                        + (long)local_9a0);
            local_b60 = ((lVar68 + local_950 * 0x48 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_ba8 = ((local_950 * 0x90 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_a00 = (double *)
                        (((local_950 * 0xb0 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8
                         + lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0);
            local_910 = (local_998 + lVar63 * 8 + lVar45 * -8) * lVar65 + local_968 * 8 +
                        lVar55 * -8 + (long)local_9a0;
            local_918 = ((local_638 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_8b0 = (lVar63 * 8 + (local_9f0 - lVar60) * local_808 * 8 + lVar45 * -8) * lVar65 +
                        local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_8b8 = (long)(local_878 + (lVar63 - lVar45)) * lVar65 + local_968 * 8 + lVar55 * -8
                        + (long)local_9a0;
            local_8c0 = ((local_950 * 0x98 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_8c8 = ((local_640 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_8d0 = local_968 * 8 +
                        ((local_950 * 0xa8 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + lVar55 * -8 + (long)local_9a0;
            local_8d8 = ((local_4d0 + local_9f0 * 8 + lVar60 * -8) * local_808 + lVar63 * 8 +
                        lVar45 * -8) * lVar65 + local_968 * 8 + lVar55 * -8 + (long)local_9a0;
            local_8e0 = (local_880 + lVar63 * 8 + lVar45 * -8) * lVar65 + local_968 * 8 +
                        lVar55 * -8 + (long)local_9a0;
            local_764 = ~iVar2 + local_7a8._4_4_;
            local_9e0 = (local_950 * 0x10 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_9e8 = (local_950 * 0xc0 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_a48 = (local_950 * 200 + local_9f0 * 8 + lVar60 * -8) * local_808;
            local_a58 = local_788 * local_668 * 8;
            local_888 = ((local_680 * 0x10 + local_9f0 * 8 + local_778 * -8) * local_788 +
                         lVar63 * 8 + lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 +
                        (long)local_660;
            local_890 = ((lVar68 + local_680 * 0x18 + local_778 * -8) * local_788 + lVar63 * 8 +
                        lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 + (long)local_660;
            local_898 = ((local_680 * 0x20 + local_9f0 * 8 + local_778 * -8) * local_788 +
                         lVar63 * 8 + lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 +
                        (long)local_660;
            local_8a0 = ((lVar68 + local_680 * 0x28 + local_778 * -8) * local_788 + lVar63 * 8 +
                        lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 + (long)local_660;
            local_7f0 = ((local_680 * 0x30 + local_9f0 * 8 + local_778 * -8) * local_788 +
                         lVar63 * 8 + lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 +
                        (long)local_660;
            local_7f8 = ((local_680 * 0x38 + local_9f0 * 8 + local_778 * -8) * local_788 +
                         lVar63 * 8 + lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 +
                        (long)local_660;
            local_970 = CONCAT44(local_970._4_4_,iStack_79c);
            uVar72 = (iStack_79c - (int)local_7a8) + 1;
            local_a80 = (ulong)uVar72;
            local_4b0 = (ulong)local_798;
            local_978 = CONCAT44(local_978._4_4_,local_798 + 1);
            local_9d0 = lVar65 * 8;
            local_4b8 = local_8f0 * 8;
            local_508 = local_950 * 0xa0;
            local_9d8 = local_668 * 8;
            local_a10 = local_a40;
            local_950 = ((local_680 * 8 + local_9f0 * 8 + local_778 * -8) * local_788 + lVar63 * 8 +
                        lVar37 * -8) * local_668 + local_968 * 8 + lVar33 * -8 + (long)local_660;
            do {
              if (local_7a8._4_4_ <= (int)local_798) {
                lVar55 = (long)(int)local_800;
                local_980 = (double *)((local_4c8 + lVar55 * 8) * local_808);
                pdVar64 = (double *)
                          ((long)(local_980 + (lVar63 - lVar45)) * lVar65 + (long)local_a40);
                pdVar70 = (double *)
                          (((local_4d8 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                          (long)local_a40);
                pdVar51 = (double *)
                          (((local_508 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                          (long)local_a40);
                local_c48 = (double *)
                            (((local_638 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                            (long)local_a40);
                pdVar80 = (double *)
                          (((local_640 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                          (long)local_a40);
                local_c18 = (double *)
                            (((local_4e0 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                            (long)local_a40);
                local_c20 = (double *)
                            (((local_4d0 + lVar55 * 8) * local_808 + local_4c0) * lVar65 +
                            (long)local_a40);
                local_938 = (local_4e8 + lVar55 * 8) * local_808;
                local_bb8 = (double *)((local_4c0 + local_938) * lVar65 + (long)local_a40);
                local_988 = (local_4f0 + lVar55 * 8) * local_808;
                local_990 = (local_4f8 + lVar55 * 8) * local_808;
                lVar73 = (local_9f0 - lVar60) * local_8f0;
                local_a68 = (int)(uVar31 + (int)local_9f0) * local_8f0;
                local_c00 = (double *)local_898;
                local_b10 = local_890;
                local_b90 = local_888;
                local_c68 = (double *)local_950;
                local_a38 = CONCAT44(local_a38._4_4_,local_764);
                local_bc0 = local_8e0;
                local_c80 = local_8d8;
                local_bd8 = local_8d0;
                local_c70 = local_8c8;
                local_be0 = (int *)local_8c0;
                local_c40 = local_8b8;
                local_bc8 = (double *)local_8b0;
                local_bd0 = local_918;
                local_b68 = (double *)local_910;
                local_b80 = local_a00;
                local_c50 = (double *)local_ba8;
                local_b88 = local_b60;
                uVar104 = local_7f8;
                lVar55 = local_7f0;
                pdVar74 = local_908;
                lVar68 = local_8a0;
                local_b00 = lVar63;
                do {
                  if ((int)local_7a8 <= iStack_79c) {
                    lVar56 = (long)(int)local_a38;
                    lVar75 = (lVar50 + lVar56 * 8) * lVar65;
                    lVar82 = (local_a48 + lVar56 * 8) * lVar65;
                    lVar48 = ((local_4f8 + lVar35 + lVar60 * -8) * local_808 + lVar56 * 8) * lVar65;
                    lVar59 = (local_b00 - lVar45) * lVar65;
                    lVar76 = (int)(uVar43 + (int)local_b00) * lVar65;
                    lVar52 = 0;
                    do {
                      *(double *)((long)local_c68 + lVar52 * 8) =
                           (*(double *)
                             ((long)local_a40 + lVar52 * 8 + (local_990 + lVar56 * 8) * lVar65) *
                            local_288 +
                           *(double *)
                            ((long)local_a40 + lVar52 * 8 + (local_988 + lVar56 * 8) * lVar65) *
                           local_218 +
                           *(double *)
                            ((long)local_a40 + lVar52 * 8 + (local_938 + lVar56 * 8) * lVar65) *
                           local_268) *
                           *(double *)
                            ((long)local_a40 + lVar52 * 8 + (long)(local_980 + lVar56) * lVar65) +
                           (local_c20[lVar52] * local_288 +
                           pdVar51[lVar52] * local_218 + local_bb8[lVar52] * local_268) *
                           pdVar64[lVar52] +
                           (*(double *)(local_c80 + lVar52 * 8) * local_288 +
                           *(double *)((long)local_c50 + lVar52 * 8) * local_218 +
                           *(double *)(local_bc0 + lVar52 * 8) * local_268) * pdVar74[lVar52] +
                           (*(double *)((long)local_a10 + lVar52 * 8 + lVar48) * local_288 +
                           *(double *)
                            ((long)local_a10 + lVar52 * 8 + (local_9e8 + lVar56 * 8) * lVar65) *
                           local_218 +
                           *(double *)
                            ((long)local_a10 + lVar52 * 8 + (local_880 + lVar56 * 8) * lVar65) *
                           local_268) * *(double *)((long)local_a10 + lVar52 * 8 + lVar75);
                      lVar78 = (long)(~iVar15 + (int)local_7a8 + (int)lVar52);
                      lVar77 = local_900 + lVar59 * 8 + lVar78 * 8;
                      *(double *)(local_b90 + lVar52 * 8) =
                           (local_9a0[lVar59 + lVar78 + local_a68 + lVar44 * 7] * local_288 +
                           local_9a0[lVar59 + lVar78 + local_a68 + lVar44 * 0x17] * local_238 +
                           local_9a0[lVar59 + lVar78 + local_a68 + lVar44 * 0x11] * local_228) *
                           *(double *)(lVar77 + local_a68 * 8) +
                           (pdVar80[lVar52] * local_288 +
                           local_c18[lVar52] * local_238 + pdVar70[lVar52] * local_228) *
                           pdVar64[lVar52] +
                           (*(double *)(local_c70 + lVar52 * 8) * local_288 +
                           *(double *)(local_bd8 + lVar52 * 8) * local_238 +
                           *(double *)(local_b88 + lVar52 * 8) * local_228) * pdVar74[lVar52] +
                           (local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 7] * local_288 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0x15] * local_238 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0xf] * local_228) *
                           *(double *)(lVar77 + lVar73 * 8);
                      *(double *)(local_b10 + lVar52 * 8) =
                           (local_9a0[lVar76 + lVar73 + lVar78 + lVar44 * 8] * local_278 +
                           local_9a0[lVar76 + lVar73 + lVar78 + lVar44 * 0x19] * local_238 +
                           local_9a0[lVar76 + lVar73 + lVar78 + lVar44 * 0x10] * local_268) *
                           *(double *)(local_900 + lVar76 * 8 + lVar73 * 8 + lVar78 * 8) +
                           (*(double *)
                             ((long)local_a10 + lVar52 * 8 + (local_9e0 + lVar56 * 8) * lVar65) *
                            local_278 +
                           *(double *)((long)local_a10 + lVar52 * 8 + lVar82) * local_238 +
                           *(double *)
                            ((long)local_a10 + lVar52 * 8 + (long)(local_878 + lVar56) * lVar65) *
                           local_268) * *(double *)((long)local_a10 + lVar52 * 8 + lVar75) +
                           (*(double *)((long)local_bc8 + lVar52 * 8) * local_278 +
                           *(double *)((long)local_be0 + lVar52 * 8) * local_238 +
                           *(double *)(local_c40 + lVar52 * 8) * local_268) * pdVar74[lVar52] +
                           (local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 6] * local_278 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0x13] * local_238 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0x10] * local_268) *
                           *(double *)(lVar77 + lVar73 * 8);
                      *(double *)((long)local_c00 + lVar52 * 8) =
                           (*(double *)(local_bd0 + lVar52 * 8) * local_298 +
                           *(double *)(local_bd8 + lVar52 * 8) * local_258 +
                           *(double *)(local_bc0 + lVar52 * 8) * local_208) * pdVar74[lVar52] +
                           (local_c48[lVar52] * local_298 +
                           local_c18[lVar52] * local_258 + local_bb8[lVar52] * local_208) *
                           pdVar64[lVar52];
                      *(double *)(lVar68 + lVar52 * 8) =
                           (*(double *)(local_c80 + lVar52 * 8) * local_168 +
                           *(double *)((long)local_be0 + lVar52 * 8) * local_258 +
                           *(double *)((long)local_b68 + lVar52 * 8) * local_178) * pdVar74[lVar52]
                           + (*(double *)((long)local_a10 + lVar52 * 8 + lVar48) * local_168 +
                             *(double *)((long)local_a10 + lVar52 * 8 + lVar82) * local_258 +
                             *(double *)
                              ((long)local_a10 + lVar52 * 8 + (local_998 + lVar56 * 8) * lVar65) *
                             local_178) * *(double *)((long)local_a10 + lVar52 * 8 + lVar75);
                      *(double *)(lVar55 + lVar52 * 8) =
                           (*(double *)(local_c70 + lVar52 * 8) * local_168 +
                           local_b80[lVar52] * local_248 +
                           *(double *)(local_c40 + lVar52 * 8) * local_208) * pdVar74[lVar52] +
                           (local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 7] * local_168 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0x16] * local_248 +
                           local_9a0[lVar59 + lVar78 + lVar73 + lVar44 * 0x10] * local_208) *
                           *(double *)(lVar77 + lVar73 * 8);
                      *(double *)(uVar104 + lVar52 * 8) =
                           (*(double *)(local_bd0 + lVar52 * 8) * local_148 +
                           local_b80[lVar52] * local_158 +
                           *(double *)((long)local_b68 + lVar52 * 8) * (double)local_1f8._0_8_) *
                           pdVar74[lVar52];
                      lVar52 = lVar52 + 1;
                    } while (uVar72 != (uint)lVar52);
                  }
                  local_b00 = local_b00 + 1;
                  pdVar64 = pdVar64 + lVar65;
                  pdVar74 = pdVar74 + lVar65;
                  pdVar70 = pdVar70 + lVar65;
                  pdVar51 = pdVar51 + lVar65;
                  local_c48 = local_c48 + lVar65;
                  pdVar80 = pdVar80 + lVar65;
                  local_c18 = local_c18 + lVar65;
                  local_c20 = local_c20 + lVar65;
                  local_bb8 = local_bb8 + lVar65;
                  local_b88 = local_b88 + local_9d0;
                  local_c50 = (double *)((long)local_c50 + local_9d0);
                  local_b80 = local_b80 + lVar65;
                  local_b68 = (double *)((long)local_b68 + local_9d0);
                  local_bd0 = local_bd0 + local_9d0;
                  local_bc8 = (double *)((long)local_bc8 + local_9d0);
                  local_c40 = local_c40 + local_9d0;
                  local_be0 = (int *)((long)local_be0 + local_9d0);
                  local_c70 = local_c70 + local_9d0;
                  local_bd8 = local_bd8 + local_9d0;
                  local_c80 = local_c80 + local_9d0;
                  local_bc0 = local_bc0 + local_9d0;
                  local_a38 = CONCAT44(local_a38._4_4_,(int)local_a38 + 1);
                  local_c68 = (double *)((long)local_c68 + local_9d8);
                  local_b90 = local_b90 + local_9d8;
                  local_b10 = local_b10 + local_9d8;
                  local_c00 = (double *)((long)local_c00 + local_9d8);
                  lVar68 = lVar68 + local_9d8;
                  lVar55 = lVar55 + local_9d8;
                  uVar104 = uVar104 + local_9d8;
                } while (local_798 + 1 != (int)local_b00);
              }
              local_9f0 = local_9f0 + 1;
              local_800 = CONCAT44(local_800._4_4_,(int)local_800 + 1);
              local_908 = local_908 + local_8f0;
              local_b60 = local_b60 + local_4b8;
              local_ba8 = local_ba8 + local_4b8;
              local_a00 = local_a00 + local_8f0;
              local_910 = local_910 + local_4b8;
              local_918 = local_918 + local_4b8;
              local_8b0 = local_8b0 + local_4b8;
              local_8b8 = local_8b8 + local_4b8;
              local_8c0 = local_8c0 + local_4b8;
              local_8c8 = local_8c8 + local_4b8;
              local_8d0 = local_8d0 + local_4b8;
              local_8d8 = local_8d8 + local_4b8;
              local_8e0 = local_8e0 + local_4b8;
              local_a10 = local_a10 + local_8f0;
              local_950 = local_950 + local_a58;
              local_888 = local_888 + local_a58;
              local_890 = local_890 + local_a58;
              local_898 = local_898 + local_a58;
              local_8a0 = local_8a0 + local_a58;
              local_7f0 = local_7f0 + local_a58;
              local_7f8 = local_7f8 + local_a58;
            } while (local_a5c != (FabType)local_9f0);
          }
          lVar55 = (long)local_71c.smallend.vect[2];
          lVar35 = local_a50;
          lVar44 = local_a18;
          lVar65 = local_948;
          if (local_71c.smallend.vect[2] <= local_71c.bigend.vect[2]) {
            lVar75 = (long)local_71c.smallend.vect[1];
            lVar50 = (long)local_71c.smallend.vect[0];
            local_9f8 = (double *)
                        ((long)local_9f8 +
                        (lVar75 * 8 + (lVar55 - local_8e8) * local_810 * 8 + local_940 * -8) *
                        local_a18 + lVar50 * 8 + local_8f8 * -8);
            lVar44 = local_680 * 0x38 + lVar55 * 8 + local_778 * -8;
            lVar60 = lVar55 * 8 + local_680 * 0x28 + local_778 * -8;
            lVar45 = local_680 * 0x30 + lVar55 * 8 + local_778 * -8;
            lVar35 = lVar55 * 8 + local_680 * 0x18 + local_778 * -8;
            lVar73 = (lVar44 + -8) * local_788 + lVar75 * 8 + lVar37 * -8;
            lVar65 = lVar44 * local_788 + lVar75 * 8 + lVar37 * -8;
            lVar68 = (local_680 * 0x20 + lVar55 * 8 + local_778 * -8) * local_788 + lVar75 * 8 +
                     lVar37 * -8;
            lVar63 = (lVar45 + -8) * local_788 + lVar75 * 8 + lVar37 * -8;
            lVar45 = lVar45 * local_788 + lVar75 * 8 + lVar37 * -8;
            lVar44 = (local_680 * 0x10 + lVar55 * 8 + local_778 * -8) * local_788 + lVar75 * 8 +
                     lVar37 * -8;
            local_a80 = lVar73 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_b00 = lVar50 * 8 +
                        ((lVar60 + -8) * local_788 + lVar75 * 8 + lVar37 * -8) * local_668 +
                        lVar33 * -8 + (long)local_660;
            local_a38 = lVar65 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_ab8 = (lVar60 * local_788 + lVar75 * 8 + lVar37 * -8) * local_668 + lVar50 * 8 +
                        lVar33 * -8 + (long)local_660;
            local_ac0 = lVar68 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_968 = ((local_680 * 8 + lVar55 * 8 + local_778 * -8) * local_788 + lVar75 * 8 +
                        lVar37 * -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_970 = (lVar73 + -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_978 = (lVar65 + -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_9d0 = (lVar68 + -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_9d8 = lVar63 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_a10 = (double *)
                        (((lVar35 + -8) * local_788 + lVar75 * 8 + lVar37 * -8) * local_668 +
                         lVar50 * 8 + lVar33 * -8 + (long)local_660);
            local_a40 = (double *)
                        (((local_680 * 0x40 + lVar55 * 8 + local_778 * -8) * local_788 + lVar75 * 8
                         + lVar37 * -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660);
            local_980 = (double *)
                        ((lVar75 * 8 + (lVar55 - local_778) * local_788 * 8 + lVar37 * -8) *
                         local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660);
            local_938 = lVar45 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_988 = (lVar35 * local_788 + lVar75 * 8 + lVar37 * -8) * local_668 + lVar50 * 8 +
                        lVar33 * -8 + (long)local_660;
            local_990 = lVar44 * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_9e0 = (lVar63 + -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_9e8 = lVar50 * 8 + (lVar45 + -8) * local_668 + lVar33 * -8 + (long)local_660;
            local_a48 = (lVar44 + -8) * local_668 + lVar50 * 8 + lVar33 * -8 + (long)local_660;
            local_a20 = (int *)((long)local_a20 +
                               (lVar75 * 4 + (lVar55 - local_930) * local_a88 * 4 + local_928 * -4)
                               * local_a50 + lVar50 * 4 + local_920 * -4);
            lVar60 = local_788 * local_668;
            lVar68 = lVar60 * 8;
            local_a68 = local_668 * 8;
            lVar63 = local_a88 * local_a50;
            local_a88 = lVar63 * 4;
            local_a70 = CONCAT44(local_a70._4_4_,local_71c.bigend.vect[0]);
            local_998 = (ulong)(uint)local_71c.bigend.vect[1];
            local_a78 = CONCAT44(local_a78._4_4_,local_71c.bigend.vect[1] + 1U);
            local_a08 = CONCAT44(local_a08._4_4_,local_71c.smallend.vect[0] + 1);
            lVar45 = lVar50 * 8;
            local_af8 = lVar55 + -1;
            local_940 = lVar75 + -1;
            local_9a0 = (double *)CONCAT44(local_9a0._4_4_,local_71c.smallend.vect[1] + 1);
            iVar15 = local_71c.smallend.vect[2];
            do {
              iVar15 = iVar15 + 1;
              if (local_71c.smallend.vect[1] <= local_71c.bigend.vect[1]) {
                local_a28 = lVar55 - 1;
                iVar32 = (int)lVar55 + 1;
                local_a30 = CONCAT44(local_a30._4_4_,iVar32);
                local_be0 = local_a20;
                local_c50 = (double *)local_a48;
                local_bb8 = (double *)local_9e8;
                local_c70 = local_9e0;
                local_c68 = (double *)local_990;
                local_c40 = local_988;
                local_c60 = (double *)local_938;
                local_c08 = local_980;
                local_b68 = local_a40;
                local_bf0 = local_a10;
                local_c58 = (double *)local_9d8;
                local_c28 = local_9d0;
                local_c38 = local_978;
                local_bf8 = local_970;
                local_c10 = local_968;
                local_c48 = (double *)local_ac0;
                local_c18 = (double *)local_ab8;
                local_c20 = (double *)local_a38;
                local_bc0 = local_b00;
                local_bd8 = local_a80;
                local_bc8 = local_9f8;
                lVar35 = lVar75;
                local_b30 = local_940;
                iVar2 = local_71c.smallend.vect[1] + 1;
                do {
                  if (local_71c.smallend.vect[0] <= local_71c.bigend.vect[0]) {
                    lVar73 = lVar35 - local_700.begin.y;
                    lVar54 = local_700.jstride * lVar73;
                    lVar44 = (long)local_700.begin.z;
                    lVar77 = local_700.kstride * (lVar55 - lVar44);
                    lVar78 = (lVar73 + -1) * local_700.jstride;
                    lVar83 = (((int)lVar35 - local_700.begin.y) + 1) * local_700.jstride;
                    lVar79 = (local_a28 - lVar44) * local_700.kstride;
                    lVar38 = (iVar32 - local_700.begin.z) * local_700.kstride;
                    lVar61 = (lVar55 - local_6c0.begin.z) * local_6c0.kstride;
                    lVar67 = (lVar35 - local_6c0.begin.y) * local_6c0.jstride;
                    lVar57 = (long)local_6c0.begin.x;
                    lVar84 = local_700.jstride * 8;
                    lVar73 = lVar73 * lVar84;
                    lVar81 = local_700.kstride * 8;
                    lVar59 = (iVar15 - local_700.begin.z) * lVar81;
                    lVar76 = (local_af8 - lVar44) * lVar81;
                    lVar81 = lVar81 * (lVar55 - lVar44);
                    lVar56 = (local_b30 - local_700.begin.y) * lVar84;
                    lVar84 = (iVar2 - local_700.begin.y) * lVar84;
                    lVar52 = (long)local_700.begin.x;
                    lVar44 = lVar73 + lVar59 + lVar52 * -8 + lVar45;
                    lVar65 = lVar76 + lVar73 + lVar52 * -8 + lVar45;
                    lVar73 = lVar73 + lVar81 + lVar52 * -8 + lVar45;
                    lVar82 = lVar56 + lVar59 + lVar52 * -8 + lVar45;
                    lVar48 = lVar76 + lVar56 + lVar52 * -8 + lVar45;
                    lVar56 = lVar56 + lVar81 + lVar52 * -8 + lVar45;
                    lVar59 = lVar59 + lVar84 + lVar52 * -8 + lVar45;
                    lVar76 = lVar76 + lVar84 + lVar52 * -8 + lVar45;
                    lVar52 = lVar84 + lVar81 + lVar52 * -8 + lVar45;
                    lVar84 = 0;
                    do {
                      if (((lVar50 + lVar84 < (long)local_aa8.smallend.vect[0]) ||
                          (lVar35 < local_aa8.smallend.vect[1])) ||
                         ((lVar55 < local_aa8.smallend.vect[2] ||
                          ((((long)local_aa8.bigend.vect[0] < lVar50 + lVar84 ||
                            (local_aa8.bigend.vect[1] < lVar35)) ||
                           (local_aa8.bigend.vect[2] < lVar55)))))) {
                        local_6c0.p[lVar50 + ((lVar61 + lVar67 + lVar84) - lVar57)] = 0.0;
                      }
                      else {
                        local_c08[lVar84] =
                             -(*(double *)(local_c10 + -8 + lVar84 * 8) +
                               *(double *)(local_c10 + lVar84 * 8) +
                               *(double *)((long)local_c50 + lVar84 * 8) +
                               *(double *)((long)local_c68 + lVar84 * 8) + local_bf0[lVar84] +
                               *(double *)(local_c40 + lVar84 * 8) +
                               *(double *)(local_c28 + -8 + lVar84 * 8) +
                               *(double *)(local_c28 + lVar84 * 8) +
                               *(double *)((long)local_c48 + -8 + lVar84 * 8) +
                               *(double *)((long)local_c48 + lVar84 * 8) +
                               *(double *)(local_bc0 + -8 + lVar84 * 8) +
                               *(double *)(local_bc0 + lVar84 * 8) +
                               *(double *)((long)local_c18 + -8 + lVar84 * 8) +
                               *(double *)((long)local_c18 + lVar84 * 8) +
                               *(double *)(local_c70 + lVar84 * 8) +
                               *(double *)((long)local_c58 + lVar84 * 8) +
                               *(double *)((long)local_bb8 + lVar84 * 8) +
                               *(double *)((long)local_c60 + lVar84 * 8) +
                               *(double *)(local_bf8 + -8 + lVar84 * 8) +
                               *(double *)(local_bf8 + lVar84 * 8) +
                               *(double *)((local_bd8 - 8) + lVar84 * 8) +
                               *(double *)(local_bd8 + lVar84 * 8) +
                               *(double *)(local_c38 + -8 + lVar84 * 8) +
                               *(double *)(local_c38 + lVar84 * 8) +
                               *(double *)(((long)local_c20 - 8U) + lVar84 * 8) +
                              *(double *)((long)local_c20 + lVar84 * 8));
                        local_b68[lVar84] =
                             1.0 / (ABS(*(double *)((long)local_c20 + lVar84 * 8)) +
                                    ABS(*(double *)(((long)local_c20 - 8U) + lVar84 * 8)) +
                                    ABS(*(double *)(local_c38 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c38 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)(local_bd8 + lVar84 * 8)) +
                                    ABS(*(double *)((local_bd8 - 8) + lVar84 * 8)) +
                                    ABS(*(double *)(local_bf8 + lVar84 * 8)) +
                                    ABS(*(double *)(local_bf8 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c60 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_bb8 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c58 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c70 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c18 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c18 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)(local_bc0 + lVar84 * 8)) +
                                    ABS(*(double *)(local_bc0 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c48 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c48 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c28 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c28 + -8 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c40 + lVar84 * 8)) +
                                    ABS(local_bf0[lVar84]) +
                                    ABS(*(double *)((long)local_c68 + lVar84 * 8)) +
                                    ABS(*(double *)((long)local_c50 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c10 + lVar84 * 8)) +
                                    ABS(*(double *)(local_c10 + -8 + lVar84 * 8)) + 1e-100);
                        dVar91 = 0.0;
                        if (local_be0[lVar84] == 0) {
                          lVar81 = (long)(((local_71c.smallend.vect[0] + 1) - local_700.begin.x) +
                                         (int)lVar84);
                          dVar91 = local_700.p[lVar83 + lVar81 + lVar38] *
                                   *(double *)((long)local_c20 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar59 + -8) *
                                   *(double *)(((long)local_c20 - 8U) + lVar84 * 8) +
                                   local_700.p[lVar78 + lVar81 + lVar38] *
                                   *(double *)(local_c38 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar82 + -8) *
                                   *(double *)(local_c38 + -8 + lVar84 * 8) +
                                   local_700.p[lVar83 + lVar81 + lVar79] *
                                   *(double *)(local_bd8 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar76 + -8) *
                                   *(double *)((local_bd8 - 8) + lVar84 * 8) +
                                   local_700.p[lVar78 + lVar81 + lVar79] *
                                   *(double *)(local_bf8 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar48 + -8) *
                                   *(double *)(local_bf8 + -8 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar59) *
                                   *(double *)((long)local_c60 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar82) *
                                   *(double *)((long)local_bb8 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar76) *
                                   *(double *)((long)local_c58 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar48) *
                                   *(double *)(local_c70 + lVar84 * 8) +
                                   local_700.p[lVar54 + lVar81 + lVar38] *
                                   *(double *)((long)local_c18 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar44 + -8) *
                                   *(double *)((long)local_c18 + -8 + lVar84 * 8) +
                                   local_700.p[lVar54 + lVar81 + lVar79] *
                                   *(double *)(local_bc0 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar65 + -8) *
                                   *(double *)(local_bc0 + -8 + lVar84 * 8) +
                                   local_700.p[lVar83 + lVar81 + lVar77] *
                                   *(double *)((long)local_c48 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar52 + -8) *
                                   *(double *)((long)local_c48 + -8 + lVar84 * 8) +
                                   local_700.p[lVar78 + lVar81 + lVar77] *
                                   *(double *)(local_c28 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar56 + -8) *
                                   *(double *)(local_c28 + -8 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar44) *
                                   *(double *)(local_c40 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar65) *
                                   local_bf0[lVar84] +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar52) *
                                   *(double *)((long)local_c68 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar56) *
                                   *(double *)((long)local_c50 + lVar84 * 8) +
                                   local_700.p[lVar54 + lVar81 + lVar77] *
                                   *(double *)(local_c10 + lVar84 * 8) +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar73) *
                                   local_c08[lVar84] +
                                   *(double *)((long)local_700.p + lVar84 * 8 + lVar73 + -8) *
                                   *(double *)(local_c10 + -8 + lVar84 * 8);
                        }
                        local_6c0.p[lVar50 + ((lVar61 + lVar67 + lVar84) - lVar57)] = dVar91;
                        local_6c0.p[lVar50 + ((lVar61 + lVar67 + lVar84) - lVar57)] =
                             local_bc8[lVar84] - dVar91;
                      }
                      lVar84 = lVar84 + 1;
                    } while ((local_71c.bigend.vect[0] - local_71c.smallend.vect[0]) + 1 !=
                             (int)lVar84);
                  }
                  lVar35 = lVar35 + 1;
                  local_bc8 = local_bc8 + local_a18;
                  local_b30 = local_b30 + 1;
                  iVar2 = iVar2 + 1;
                  local_bd8 = local_bd8 + local_a68;
                  local_bc0 = local_bc0 + local_a68;
                  local_c20 = (double *)((long)local_c20 + local_a68);
                  local_c18 = (double *)((long)local_c18 + local_a68);
                  local_c48 = (double *)((long)local_c48 + local_a68);
                  local_c10 = local_c10 + local_a68;
                  local_bf8 = local_bf8 + local_a68;
                  local_c38 = local_c38 + local_a68;
                  local_c28 = local_c28 + local_a68;
                  local_c58 = (double *)((long)local_c58 + local_a68);
                  local_bf0 = local_bf0 + local_668;
                  local_b68 = local_b68 + local_668;
                  local_c08 = local_c08 + local_668;
                  local_c60 = (double *)((long)local_c60 + local_a68);
                  local_c40 = local_c40 + local_a68;
                  local_c68 = (double *)((long)local_c68 + local_a68);
                  local_c70 = local_c70 + local_a68;
                  local_bb8 = (double *)((long)local_bb8 + local_a68);
                  local_c50 = (double *)((long)local_c50 + local_a68);
                  local_be0 = local_be0 + local_a50;
                } while (local_71c.bigend.vect[1] + 1U != (int)lVar35);
              }
              lVar55 = lVar55 + 1;
              local_9f8 = local_9f8 + local_948;
              local_af8 = local_af8 + 1;
              local_a80 = local_a80 + lVar68;
              local_b00 = local_b00 + lVar68;
              local_a38 = local_a38 + lVar68;
              local_ab8 = local_ab8 + lVar68;
              local_ac0 = local_ac0 + lVar68;
              local_968 = local_968 + lVar68;
              local_970 = local_970 + lVar68;
              local_978 = local_978 + lVar68;
              local_9d0 = local_9d0 + lVar68;
              local_9d8 = local_9d8 + lVar68;
              local_a10 = local_a10 + lVar60;
              local_a40 = local_a40 + lVar60;
              local_980 = local_980 + lVar60;
              local_938 = local_938 + lVar68;
              local_988 = local_988 + lVar68;
              local_990 = local_990 + lVar68;
              local_9e0 = local_9e0 + lVar68;
              local_9e8 = local_9e8 + lVar68;
              local_a48 = local_a48 + lVar68;
              local_a20 = local_a20 + lVar63;
              lVar35 = local_a50 * 4;
              lVar44 = local_a18 * 8;
              lVar65 = local_948 * 8;
            } while (local_71c.bigend.vect[2] + 1 != (int)lVar55);
          }
          local_948 = lVar65;
          local_a18 = lVar44;
          local_a50 = lVar35;
          local_678 = lVar37;
          local_670 = lVar33;
          _local_618 = uVar27;
          Gpu::Elixir::~Elixir(&local_60);
          Gpu::Elixir::~Elixir(&local_138);
          lVar35 = local_a50;
          lVar55 = local_a18;
          lVar60 = local_948;
        }
        else {
          iVar15 = (int)local_848;
          if ((int)local_848 <= local_9c8.smallend.vect[0]) {
            iVar15 = local_9c8.smallend.vect[0];
          }
          iVar2 = local_848._4_4_;
          if (local_848._4_4_ <= local_9c8.smallend.vect[1]) {
            iVar2 = local_9c8.smallend.vect[1];
          }
          lVar35 = (long)local_9c8.smallend.vect[2];
          iVar32 = local_840;
          if (local_840 <= local_9c8.smallend.vect[2]) {
            iVar32 = local_9c8.smallend.vect[2];
          }
          iVar47 = local_83c[0];
          if (local_9c8.bigend.vect[0] <= local_83c[0]) {
            iVar47 = local_9c8.bigend.vect[0];
          }
          iVar42 = local_9c8.bigend.vect[1];
          if (local_83c[1] < local_9c8.bigend.vect[1]) {
            iVar42 = local_83c[1];
          }
          iVar30 = local_9c8.bigend.vect[2];
          if ((int)uStack_834 < local_9c8.bigend.vect[2]) {
            iVar30 = (int)uStack_834;
          }
          if (*local_658 == 0) {
            if (local_9c8.smallend.vect[2] <= local_9c8.bigend.vect[2]) {
              RVar12 = local_820->m_const_sigma;
              do {
                if (local_9c8.smallend.vect[1] <= local_9c8.bigend.vect[1]) {
                  lVar55 = (long)local_9c8.smallend.vect[1];
                  do {
                    if (local_9c8.smallend.vect[0] <= local_9c8.bigend.vect[0]) {
                      lVar60 = (long)local_9c8.smallend.vect[0];
                      iVar58 = (local_9c8.bigend.vect[0] - local_9c8.smallend.vect[0]) + 1;
                      do {
                        if (((((lVar60 < iVar15) || (lVar55 < iVar2)) || (lVar35 < iVar32)) ||
                            ((iVar47 < lVar60 || (iVar42 < lVar55)))) ||
                           (RVar99 = RVar12,
                           lVar68 = (lVar35 - lVar65) * lVar37 + (lVar55 - lVar44) * lVar45,
                           iVar30 < lVar35)) {
                          RVar99 = 0.0;
                          lVar68 = (lVar35 - lVar65) * lVar37 + (lVar55 - lVar44) * lVar45;
                        }
                        (pdVar74 + lVar68)[lVar60 - local_a58] = RVar99;
                        lVar60 = lVar60 + 1;
                        iVar58 = iVar58 + -1;
                      } while (iVar58 != 0);
                    }
                    lVar55 = lVar55 + 1;
                  } while (local_9c8.bigend.vect[1] + 1 != (int)lVar55);
                }
                lVar35 = lVar35 + 1;
              } while (local_9c8.bigend.vect[2] + 1 != (int)lVar35);
            }
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_5b8,(FabArray<amrex::FArrayBox> *)*local_658,&local_4a8);
            lVar35 = (long)local_9c8.smallend.vect[2];
            if (local_9c8.smallend.vect[2] <= local_9c8.bigend.vect[2]) {
              lVar55 = (long)local_9c8.smallend.vect[0];
              do {
                if (local_9c8.smallend.vect[1] <= local_9c8.bigend.vect[1]) {
                  lVar60 = (long)local_9c8.smallend.vect[1];
                  do {
                    if (local_9c8.smallend.vect[0] <= local_9c8.bigend.vect[0]) {
                      pdVar51 = pdVar74 + (lVar35 - lVar65) * lVar37 + (lVar60 - lVar44) * lVar45;
                      lVar68 = 0;
                      do {
                        dVar91 = 0.0;
                        pdVar64 = pdVar51;
                        if ((((long)iVar15 <= lVar55 + lVar68) && (iVar2 <= lVar60)) &&
                           ((iVar32 <= lVar35 &&
                            (((lVar55 + lVar68 <= (long)iVar47 && (lVar60 <= iVar42)) &&
                             (lVar35 <= iVar30)))))) {
                          dVar91 = local_5b8.p
                                   [lVar55 + (((lVar60 - local_5b8.begin.y) * local_5b8.jstride +
                                              (lVar35 - local_5b8.begin.z) * local_5b8.kstride +
                                              lVar68) - (long)local_5b8.begin.x)];
                          pdVar64 = pdVar74 + (lVar35 - lVar65) * lVar37 +
                                              (lVar60 - lVar44) * lVar45;
                        }
                        pdVar64[(lVar55 + lVar68) - local_a58] = dVar91;
                        lVar68 = lVar68 + 1;
                      } while ((local_9c8.bigend.vect[0] - local_9c8.smallend.vect[0]) + 1 !=
                               (int)lVar68);
                    }
                    lVar60 = lVar60 + 1;
                  } while (local_9c8.bigend.vect[1] + 1 != (int)lVar60);
                }
                lVar35 = lVar35 + 1;
              } while (local_9c8.bigend.vect[2] + 1 != (int)lVar35);
            }
          }
          local_c88 = (long)local_71c.smallend.vect[2];
          lVar35 = local_a50;
          lVar55 = local_a18;
          lVar60 = local_948;
          if (local_71c.smallend.vect[2] <= local_71c.bigend.vect[2]) {
            lVar73 = (long)local_71c.smallend.vect[1];
            lVar35 = lVar73 * 8;
            lVar50 = (long)local_71c.smallend.vect[0];
            local_9f8 = (double *)
                        ((long)local_9f8 +
                        (lVar35 + (local_c88 - local_8e8) * local_810 * 8 + local_940 * -8) *
                        local_a18 + lVar50 * 8 + local_8f8 * -8);
            local_a20 = (int *)((long)local_a20 +
                               (lVar73 * 4 + (local_c88 - local_930) * local_a88 * 4 +
                               local_928 * -4) * local_a50 + lVar50 * 4 + local_920 * -4);
            local_b78 = local_c88 + -1;
            lVar68 = lVar50 * 8;
            lVar63 = local_a88 * local_a50;
            local_a88 = lVar63 * 4;
            lVar55 = lVar35 + (local_c88 - lVar65) * lVar33 * 8 + lVar44 * -8;
            lVar35 = lVar35 + (local_b78 - lVar65) * lVar33 * 8 + lVar44 * -8;
            local_ad0 = (lVar55 + -8) * lVar45 + lVar50 * 8 + local_a58 * -8 + (long)pdVar74;
            lVar37 = lVar37 * 8;
            lVar33 = lVar45 * 8;
            local_b20 = (lVar35 + -8) * lVar45 + lVar50 * 8 + local_a58 * -8 + (long)pdVar74;
            local_ad8 = lVar55 * lVar45 + lVar50 * 8 + local_a58 * -8 + (long)pdVar74;
            local_ae0 = lVar35 * lVar45 + lVar50 * 8 + local_a58 * -8 + (long)pdVar74;
            iVar15 = local_71c.smallend.vect[2];
            do {
              iVar15 = iVar15 + 1;
              if (local_71c.smallend.vect[1] <= local_71c.bigend.vect[1]) {
                local_c78 = local_ae0;
                local_c80 = local_ad8;
                local_bb8 = (double *)local_b20;
                local_c70 = local_ad0;
                lVar35 = lVar73;
                piVar34 = local_a20;
                pdVar74 = local_9f8;
                local_b88 = lVar73 + -1;
                iVar2 = local_71c.smallend.vect[1];
                do {
                  iVar2 = iVar2 + 1;
                  if (local_71c.smallend.vect[0] <= local_71c.bigend.vect[0]) {
                    lVar55 = lVar35 - local_700.begin.y;
                    lVar59 = local_700.jstride * lVar55;
                    lVar44 = (long)local_700.begin.z;
                    lVar76 = local_700.kstride * (local_c88 - lVar44);
                    lVar61 = (lVar55 + -1) * local_700.jstride;
                    lVar52 = ((local_c88 + -1) - lVar44) * local_700.kstride;
                    lVar84 = (((int)lVar35 - local_700.begin.y) + 1) * local_700.jstride;
                    lVar77 = (((int)local_c88 + 1) - local_700.begin.z) * local_700.kstride;
                    lVar79 = (local_c88 - local_6c0.begin.z) * local_6c0.kstride;
                    lVar54 = (lVar35 - local_6c0.begin.y) * local_6c0.jstride;
                    lVar78 = (long)local_6c0.begin.x;
                    lVar38 = local_700.jstride * 8;
                    lVar55 = lVar55 * lVar38;
                    lVar82 = local_700.kstride * 8;
                    lVar48 = (iVar15 - local_700.begin.z) * lVar82;
                    lVar56 = (local_b78 - lVar44) * lVar82;
                    lVar82 = lVar82 * (local_c88 - lVar44);
                    lVar75 = (local_b88 - local_700.begin.y) * lVar38;
                    lVar38 = (iVar2 - local_700.begin.y) * lVar38;
                    lVar83 = (long)local_700.begin.x;
                    lVar44 = lVar55 + lVar48 + lVar83 * -8 + lVar68;
                    lVar65 = lVar56 + lVar55 + lVar83 * -8 + lVar68;
                    lVar55 = lVar55 + lVar82 + lVar83 * -8 + lVar68;
                    lVar45 = lVar82 + lVar75 + lVar83 * -8 + lVar68;
                    lVar60 = lVar48 + lVar75 + lVar83 * -8 + lVar68;
                    lVar75 = lVar75 + lVar56 + lVar83 * -8 + lVar68;
                    lVar82 = lVar82 + lVar38 + lVar83 * -8 + lVar68;
                    lVar48 = lVar48 + lVar38 + lVar83 * -8 + lVar68;
                    lVar56 = lVar38 + lVar56 + lVar83 * -8 + lVar68;
                    lVar83 = 0;
                    do {
                      if (((lVar50 + lVar83 < (long)local_aa8.smallend.vect[0]) ||
                          (lVar35 < local_aa8.smallend.vect[1])) ||
                         (((local_c88 < local_aa8.smallend.vect[2] ||
                           (((long)local_aa8.bigend.vect[0] < lVar50 + lVar83 ||
                            (local_aa8.bigend.vect[1] < lVar35)))) ||
                          (local_aa8.bigend.vect[2] < local_c88)))) {
                        local_6c0.p[lVar50 + ((lVar79 + lVar54 + lVar83) - lVar78)] = 0.0;
                      }
                      else {
                        dVar91 = 0.0;
                        if (piVar34[lVar83] == 0) {
                          dVar91 = *(double *)((long)local_bb8 + -8 + lVar83 * 8);
                          dVar114 = *(double *)((long)local_bb8 + lVar83 * 8);
                          dVar100 = dVar91 + dVar114;
                          dVar107 = *(double *)(local_c78 + -8 + lVar83 * 8);
                          dVar108 = *(double *)(local_c78 + lVar83 * 8);
                          dVar92 = dVar100 + dVar107 + dVar108;
                          dVar98 = *(double *)(local_c70 + -8 + lVar83 * 8);
                          dVar113 = *(double *)(local_c70 + lVar83 * 8);
                          dVar3 = *(double *)(local_c80 + -8 + lVar83 * 8);
                          dVar85 = *(double *)(local_c80 + lVar83 * 8);
                          lVar38 = (long)(((local_71c.smallend.vect[0] + 1) - local_700.begin.x) +
                                         (int)lVar83);
                          dVar91 = (dVar92 * *(double *)((long)local_700.p + lVar83 * 8 + lVar65) +
                                   (dVar98 + dVar113 + dVar3 + dVar85) *
                                   *(double *)((long)local_700.p + lVar83 * 8 + lVar44)) * local_1e8
                                   + ((dVar100 + dVar98 + dVar113) *
                                      *(double *)((long)local_700.p + lVar83 * 8 + lVar45) +
                                     (dVar107 + dVar108 + dVar3 + dVar85) *
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar82)) *
                                     local_198 +
                                     ((dVar91 + dVar107 + dVar98 + dVar3) *
                                      *(double *)((long)local_700.p + lVar83 * 8 + lVar55 + -8) +
                                     (dVar114 + dVar108 + dVar113 + dVar85) *
                                     local_700.p[lVar59 + lVar38 + lVar76]) * local_188 +
                                     ((dVar108 + dVar85) * local_700.p[lVar84 + lVar38 + lVar76] +
                                     (dVar107 + dVar3) *
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar82 + -8) +
                                     (dVar91 + dVar98) *
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar45 + -8) +
                                     (dVar114 + dVar113) * local_700.p[lVar61 + lVar38 + lVar76]) *
                                     local_1d8 +
                                     ((dVar113 + dVar85) * local_700.p[lVar59 + lVar38 + lVar77] +
                                     (dVar98 + dVar3) *
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar44 + -8) +
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar65 + -8) *
                                     (dVar91 + dVar107) +
                                     local_700.p[lVar59 + lVar38 + lVar52] * (dVar114 + dVar108)) *
                                     (double)local_1c8._0_8_ +
                                     ((dVar3 + dVar85) *
                                      *(double *)((long)local_700.p + lVar83 * 8 + lVar48) +
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar60) *
                                     (dVar98 + dVar113) +
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar75) * dVar100
                                     + *(double *)((long)local_700.p + lVar83 * 8 + lVar56) *
                                       (dVar107 + dVar108)) * local_1b8 +
                                     (local_700.p[lVar84 + lVar38 + lVar77] * dVar85 +
                                     *(double *)((long)local_700.p + lVar83 * 8 + lVar48 + -8) *
                                     dVar3 + local_700.p[lVar61 + lVar38 + lVar77] * dVar113 +
                                             *(double *)
                                              ((long)local_700.p + lVar83 * 8 + lVar60 + -8) *
                                             dVar98 + local_700.p[lVar84 + lVar38 + lVar52] *
                                                      dVar108 + *(double *)
                                                                 ((long)local_700.p +
                                                                 lVar83 * 8 + lVar56 + -8) * dVar107
                                                                + *(double *)
                                                                   ((long)local_700.p +
                                                                   lVar83 * 8 + lVar75 + -8) *
                                                                  dVar91 + local_700.p
                                                                           [lVar61 + lVar38 + lVar52
                                                                           ] * dVar114) * local_1a8
                                     + (dVar92 + dVar98 + dVar113 + dVar3 + dVar85) *
                                       *(double *)((long)local_700.p + lVar83 * 8 + lVar55) * -4.0 *
                                       local_1a8;
                        }
                        local_6c0.p[lVar50 + ((lVar79 + lVar54 + lVar83) - lVar78)] = dVar91;
                        local_6c0.p[lVar50 + ((lVar79 + lVar54 + lVar83) - lVar78)] =
                             pdVar74[lVar83] -
                             local_6c0.p[lVar50 + ((lVar79 + lVar54 + lVar83) - lVar78)];
                      }
                      lVar83 = lVar83 + 1;
                    } while ((local_71c.bigend.vect[0] - local_71c.smallend.vect[0]) + 1 !=
                             (int)lVar83);
                  }
                  lVar35 = lVar35 + 1;
                  pdVar74 = pdVar74 + local_a18;
                  piVar34 = piVar34 + local_a50;
                  local_b88 = local_b88 + 1;
                  local_c70 = local_c70 + lVar33;
                  local_bb8 = (double *)((long)local_bb8 + lVar33);
                  local_c80 = local_c80 + lVar33;
                  local_c78 = local_c78 + lVar33;
                } while (local_71c.bigend.vect[1] + 1U != (int)lVar35);
              }
              local_c88 = local_c88 + 1;
              local_9f8 = local_9f8 + local_948;
              local_a20 = local_a20 + lVar63;
              local_b78 = local_b78 + 1;
              local_ad0 = local_ad0 + lVar37;
              local_b20 = local_b20 + lVar37;
              local_ad8 = local_ad8 + lVar37;
              local_ae0 = local_ae0 + lVar37;
              lVar35 = local_a50 * 4;
              lVar55 = local_a18 * 8;
              lVar60 = local_948 * 8;
            } while (local_71c.bigend.vect[2] + 1 != (int)local_c88);
          }
        }
        local_948 = lVar60;
        local_a18 = lVar55;
        local_a50 = lVar35;
        Gpu::Elixir::~Elixir(&local_120);
        Gpu::Elixir::~Elixir(&local_108);
        Gpu::Elixir::~Elixir(&local_f0);
        lVar33 = local_528;
        lVar37 = local_530;
      }
      MFIter::operator++(&local_4a8);
    } while (local_4a8.currentIndex < local_4a8.endIndex);
  }
  MFIter::~MFIter(&local_4a8);
  local_400._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_400);
  local_3b8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_3b8);
  local_328._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837c50;
  BaseFab<int>::clear(&local_328);
  local_370._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_370);
  local_2e0._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_2e0);
  return;
}

Assistant:

void
MLNodeLaplacian::compSyncResidualFine (MultiFab& sync_resid, const MultiFab& phi, const MultiFab& vold,
                                       const MultiFab* rhcc)
{
    BL_PROFILE("MLNodeLaplacian::SyncResFine()");

    const auto& sigma_orig = m_sigma[0][0][0];
    const iMultiFab& dmsk = *m_dirichlet_mask[0][0];

    const auto lobc = LoBC();
    const auto hibc = HiBC();

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[0][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* intg = m_integral[0].get();
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

    const Geometry& geom = m_geom[0][0];
    const Box& ccdom = geom.Domain();
    const Box& nddom = amrex::surroundingNodes(ccdom);
    const auto dxinv = geom.InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox rhs, u;
        IArrayBox tmpmask;
#ifdef AMREX_USE_EB
        FArrayBox sten, cn;
#endif
        for (MFIter mfi(sync_resid,mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();

            auto typ = FabType::regular;
#ifdef AMREX_USE_EB
            if (factory) {
                typ = (*flags)[mfi].getType(amrex::enclosedCells(bx));
            }
#endif
            if (typ != FabType::covered)
            {
                const Box& gbx = mfi.growntilebox();
                const Box& vbx = mfi.validbox();
                const Box& ccvbx = amrex::enclosedCells(vbx);
                const Box& bxg1 = amrex::grow(bx,1);
                const Box& ccbxg1 = amrex::enclosedCells(bxg1);

                u.resize(ccbxg1, AMREX_SPACEDIM);
                Elixir ueli = u.elixir();
                Array4<Real> const& uarr = u.array();

                Box ovlp = ccvbx & ccbxg1;
                for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                {
                    if (m_lobc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.smallEnd(idim) == ccdom.smallEnd(idim)) {
                            ovlp.growLo(idim, 1);
                        }
                    }
                    if (m_hibc[0][idim] == LinOpBCType::inflow)
                    {
                        if (ovlp.bigEnd(idim) == ccdom.bigEnd(idim)) {
                            ovlp.growHi(idim, 1);
                        }
                    }
                }

                Array4<Real const> const& voarr = vold.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                {
                    if (ovlp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                        AMREX_D_TERM(uarr(i,j,k,0) = voarr(i,j,k,0);,
                                     uarr(i,j,k,1) = voarr(i,j,k,1);,
                                     uarr(i,j,k,2) = voarr(i,j,k,2););
                    } else {
                        AMREX_D_TERM(uarr(i,j,k,0) = 0.0;,
                                     uarr(i,j,k,1) = 0.0;,
                                     uarr(i,j,k,2) = 0.0;);
                    }
                });

                tmpmask.resize(bx);
                Elixir tmeli = tmpmask.elixir();
                Array4<int> const& tmpmaskarr = tmpmask.array();
                Array4<int const> const& dmskarr = dmsk.const_array(mfi);
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    tmpmaskarr(i,j,k) = 1-dmskarr(i,j,k);
                });

                rhs.resize(bx);
                Elixir rhseli = rhs.elixir();
                Array4<Real> const& rhsarr = rhs.array();

#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,uarr,vfracarr,intgarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
                }
                else
#endif
                {
#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc,is_rz);
                    });
#else
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                    {
                        mlndlap_divu(i,j,k,rhsarr,uarr,tmpmaskarr,dxinv,nddom,lobc,hibc);
                    });
#endif
                }

                if (rhcc)
                {
                    Array4<Real> rhccarr = uarr;
                    Array4<Real const> const& rhccarr_orig = rhcc->const_array(mfi);
                    const Box& ovlp3 = ccvbx & ccbxg1;
                    AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                    {
                        if (ovlp3.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            rhccarr(i,j,k) = rhccarr_orig(i,j,k);
                        } else {
                            rhccarr(i,j,k) = 0.0;
                        }
                    });
#ifdef AMREX_USE_EB
                    if (typ == FabType::singlevalued)
                    {
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        Array4<Real const> const& intgarr = intg->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                    else
#endif
                    {
                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            Real rhs2 = mlndlap_rhcc(i,j,k,rhccarr,tmpmaskarr);
                            rhsarr(i,j,k) += rhs2;
                        });
                    }
                }

                Array4<Real> const& sync_resid_a = sync_resid.array(mfi);
                Array4<Real const> const& phiarr = phi.const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);

                    Box stbx = bx;
                    AMREX_D_TERM(stbx.growLo(0,1);, stbx.growLo(1,1);, stbx.growLo(2,1));
                    Box const& sgbx = amrex::grow(amrex::enclosedCells(stbx),1);

                    constexpr int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
                    sten.resize(stbx,ncomp_s);
                    Elixir steneli = sten.elixir();
                    Array4<Real> const& stenarr = sten.array();

                    constexpr int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    cn.resize(sgbx,ncomp_c+1);
                    Elixir cneli = cn.elixir();
                    Array4<Real> const& cnarr = cn.array();
                    Array4<Real> const& sgarr = cn.array(ncomp_c);

                    Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const Box& ibx = sgbx & amrex::enclosedCells(mfi.validbox());
                    AMREX_HOST_DEVICE_FOR_3D(sgbx, i, j, k,
                    {
                        if (ibx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                            sgarr(i,j,k) = sigmaarr_orig(i,j,k);
                        } else {
                            for (int n = 0; n < ncomp_c; ++n) {
                                cnarr(i,j,k,n) = 0.0;
                            }
                            sgarr(i,j,k) = 0.0;
                        }
                    });

                    AMREX_HOST_DEVICE_FOR_3D(stbx, i, j, k,
                    {
                        mlndlap_set_stencil_eb(i, j, k, stenarr, sgarr, cnarr, dxinv);
                    });

                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            mlndlap_set_stencil_s0(i, j, k, stenarr);
                            sync_resid_a(i,j,k) = mlndlap_adotx_sten(i,j,k, phiarr, stenarr, tmpmaskarr);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
                }
                else
#endif
                {
                    Array4<Real> sigmaarr = uarr;
                    const Box& ovlp2 = ccvbx & ccbxg1;
                    if (sigma_orig) {
                        Array4<Real const> const& sigmaarr_orig = sigma_orig->const_array(mfi);
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = sigmaarr_orig(i,j,k);
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    } else {
                        Real const_sigma = m_const_sigma;
                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (ovlp2.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sigmaarr(i,j,k) = const_sigma;
                            } else {
                                sigmaarr(i,j,k) = 0.0;
                            }
                        });
                    }

#if (AMREX_SPACEDIM == 2)
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   is_rz, dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#else
                    AMREX_HOST_DEVICE_FOR_3D(gbx, i, j, k,
                    {
                        if (bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                            sync_resid_a(i,j,k) = mlndlap_adotx_aa(i,j,k, phiarr, sigmaarr, tmpmaskarr,
                                                                   dxinv);
                            sync_resid_a(i,j,k) = rhsarr(i,j,k) - sync_resid_a(i,j,k);
                        } else {
                            sync_resid_a(i,j,k) = 0.0;
                        }
                    });
#endif
                }
            }

            // Do not impose neumann bc here because how SyncRegister works.
        }
    }
}